

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O1

string * __thiscall
RegressionTree::dynamicFunctionsGenerator_abi_cxx11_
          (string *__return_storage_ptr__,RegressionTree *this)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  bool bVar5;
  string *psVar6;
  char cVar7;
  size_t sVar8;
  Attribute *pAVar9;
  long *plVar10;
  TDNode *pTVar11;
  undefined8 *puVar12;
  long *plVar13;
  ulong uVar14;
  size_type *psVar15;
  ulong *puVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  char cVar20;
  undefined8 uVar21;
  long lVar22;
  string evalFunction;
  string findPrediction;
  string findPredSwitch;
  string testTuple;
  string loadFunction;
  string attributeString;
  string __str_2;
  string headerFiles;
  string attrConstruct;
  string genDynFuncs;
  string varTypeList;
  string conditionsString;
  string condition [2];
  string relationName;
  string relationMap;
  string __str_1;
  string varList;
  ulong *local_cc8;
  long local_cc0;
  ulong local_cb8;
  long lStack_cb0;
  ulong *local_ca8;
  long local_ca0;
  ulong local_c98;
  long lStack_c90;
  string local_c88;
  ulong *local_c68;
  long local_c60;
  ulong local_c58;
  long lStack_c50;
  string local_c48;
  ulong *local_c28;
  long local_c20;
  ulong local_c18;
  long lStack_c10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c08;
  ulong *local_be8;
  long local_be0;
  ulong local_bd8;
  long lStack_bd0;
  ulong *local_bc8;
  long local_bc0;
  ulong local_bb8;
  long lStack_bb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba8;
  ulong *local_b88;
  long local_b80;
  ulong local_b78;
  long lStack_b70;
  ulong *local_b68;
  long local_b60;
  ulong local_b58;
  long lStack_b50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  ulong *local_b28;
  long local_b20;
  ulong local_b18;
  long lStack_b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b08;
  ulong *local_ae8;
  long local_ae0;
  ulong local_ad8;
  long lStack_ad0;
  ulong *local_ac8;
  long local_ac0;
  ulong local_ab8;
  long lStack_ab0;
  ulong *local_aa8;
  long local_aa0;
  ulong local_a98;
  long lStack_a90;
  ulong *local_a88;
  long local_a80;
  ulong local_a78;
  long lStack_a70;
  ulong *local_a68;
  long local_a60;
  ulong local_a58;
  long lStack_a50;
  ulong *local_a48;
  long local_a40;
  ulong local_a38;
  long lStack_a30;
  ulong *local_a28;
  long local_a20;
  ulong local_a18;
  long lStack_a10;
  ulong *local_a08;
  long local_a00;
  ulong local_9f8;
  long lStack_9f0;
  ulong *local_9e8;
  long local_9e0;
  ulong local_9d8;
  long lStack_9d0;
  ulong *local_9c8;
  long local_9c0;
  ulong local_9b8;
  long lStack_9b0;
  ulong *local_9a8;
  long local_9a0;
  ulong local_998;
  long lStack_990;
  ulong *local_988;
  long local_980;
  ulong local_978;
  long lStack_970;
  ulong *local_968;
  long local_960;
  ulong local_958;
  long lStack_950;
  ulong *local_948;
  long local_940;
  ulong local_938;
  long lStack_930;
  ulong *local_928;
  long local_920;
  ulong local_918;
  undefined8 uStack_910;
  ulong *local_908;
  long local_900;
  ulong local_8f8;
  undefined8 uStack_8f0;
  ulong *local_8e8;
  long local_8e0;
  ulong local_8d8;
  undefined8 uStack_8d0;
  ulong *local_8c8;
  long local_8c0;
  ulong local_8b8;
  long lStack_8b0;
  long *local_8a8;
  long local_8a0;
  long local_898;
  long lStack_890;
  ulong *local_888;
  long local_880;
  ulong local_878;
  long lStack_870;
  ulong *local_868;
  long local_860;
  ulong local_858;
  long lStack_850;
  ulong *local_848;
  long local_840;
  ulong local_838;
  long lStack_830;
  ulong *local_828;
  long local_820;
  ulong local_818;
  undefined8 uStack_810;
  string local_808;
  ulong *local_7e8;
  long local_7e0;
  ulong local_7d8;
  long lStack_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  long *local_7a8;
  long local_7a0;
  long local_798;
  long lStack_790;
  ulong *local_788;
  long local_780;
  ulong local_778;
  undefined8 uStack_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  undefined1 *local_748 [2];
  undefined1 local_738 [16];
  undefined1 *local_728 [2];
  undefined1 local_718 [24];
  ulong *local_700;
  long local_6f8;
  ulong local_6f0;
  long lStack_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  undefined1 *local_6c0 [2];
  undefined1 local_6b0 [16];
  ulong *local_6a0;
  uint local_698;
  undefined4 uStack_694;
  ulong local_690 [2];
  ulong *local_680;
  long local_678;
  ulong local_670;
  long lStack_668;
  ulong *local_660;
  long local_658;
  ulong local_650;
  long lStack_648;
  ulong *local_640;
  long local_638;
  ulong local_630;
  long lStack_628;
  ulong *local_620;
  long local_618;
  ulong local_610;
  long lStack_608;
  ulong *local_600;
  long local_5f8;
  ulong local_5f0;
  long lStack_5e8;
  ulong *local_5e0;
  long local_5d8;
  ulong local_5d0;
  long lStack_5c8;
  ulong *local_5c0;
  long local_5b8;
  ulong local_5b0;
  long lStack_5a8;
  ulong *local_5a0;
  long local_598;
  ulong local_590 [2];
  ulong *local_580;
  long local_578;
  ulong local_570 [2];
  ulong *local_560;
  long local_558;
  ulong local_550 [2];
  ulong *local_540;
  long local_538;
  ulong local_530 [2];
  ulong *local_520;
  long local_518;
  ulong local_510 [2];
  ulong *local_500;
  long local_4f8;
  ulong local_4f0 [2];
  ulong *local_4e0;
  long local_4d8;
  ulong local_4d0 [2];
  ulong *local_4c0;
  long local_4b8;
  ulong local_4b0 [2];
  ulong *local_4a0;
  long local_498;
  ulong local_490 [2];
  ulong *local_480;
  long local_478;
  ulong local_470 [2];
  ulong *local_460;
  long local_458;
  ulong local_450 [2];
  ulong *local_440;
  long local_438;
  ulong local_430 [2];
  ulong *local_420;
  long local_418;
  ulong local_410 [2];
  ulong *local_400;
  long local_3f8;
  ulong local_3f0 [2];
  ulong *local_3e0;
  long local_3d8;
  ulong local_3d0 [2];
  ulong *local_3c0;
  long local_3b8;
  ulong local_3b0 [2];
  ulong *local_3a0;
  long local_398;
  ulong local_390 [2];
  ulong *local_380;
  long local_378;
  ulong local_370 [2];
  undefined8 *local_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 *local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 *local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 *local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 *local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  ulong *local_280;
  long local_278;
  ulong local_270 [2];
  ulong *local_260;
  long local_258;
  ulong local_250 [2];
  ulong *local_240;
  long local_238;
  ulong local_230 [2];
  ulong *local_220;
  long local_218;
  ulong local_210 [2];
  ulong *local_200;
  long local_1f8;
  ulong local_1f0 [2];
  string *local_1e0;
  ulong local_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_748[0] = local_738;
  local_1e0 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748," <= ","");
  local_728[0] = local_718;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_728," == ","");
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
  local_6c0[0] = local_6b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6c0,"");
  uVar19 = 0;
  while( true ) {
    sVar8 = TreeDecomposition::numberOfAttributes
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar8 <= uVar19) break;
    pAVar9 = TreeDecomposition::getAttribute
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar19);
    local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
    pcVar4 = (pAVar9->_name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6e0,pcVar4,pcVar4 + (pAVar9->_name)._M_string_length);
    std::operator+(&local_768,"\"",&local_6e0);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_768);
    local_7a8 = &local_798;
    plVar13 = plVar10 + 2;
    if ((long *)*plVar10 == plVar13) {
      local_798 = *plVar13;
      lStack_790 = plVar10[3];
    }
    else {
      local_798 = *plVar13;
      local_7a8 = (long *)*plVar10;
    }
    local_7a0 = plVar10[1];
    *plVar10 = (long)plVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_2a0,(ulong)local_7a8);
    if (local_7a8 != &local_798) {
      operator_delete(local_7a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_768._M_dataplus._M_p != &local_768.field_2) {
      operator_delete(local_768._M_dataplus._M_p);
    }
    uVar18 = this->_queryRootIndex[uVar19];
    cVar20 = '\x01';
    if (9 < uVar18) {
      uVar14 = uVar18;
      cVar7 = '\x04';
      do {
        cVar20 = cVar7;
        if (uVar14 < 100) {
          cVar20 = cVar20 + -2;
          goto LAB_00160547;
        }
        if (uVar14 < 1000) {
          cVar20 = cVar20 + -1;
          goto LAB_00160547;
        }
        if (uVar14 < 10000) goto LAB_00160547;
        bVar5 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar7 = cVar20 + '\x04';
      } while (bVar5);
      cVar20 = cVar20 + '\x01';
    }
LAB_00160547:
    local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_768,cVar20);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_768._M_dataplus._M_p,(uint)local_768._M_string_length,uVar18);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_768);
    local_7a8 = &local_798;
    plVar13 = plVar10 + 2;
    if ((long *)*plVar10 == plVar13) {
      local_798 = *plVar13;
      lStack_790 = plVar10[3];
    }
    else {
      local_798 = *plVar13;
      local_7a8 = (long *)*plVar10;
    }
    local_7a0 = plVar10[1];
    *plVar10 = (long)plVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_6c0,(ulong)local_7a8);
    if (local_7a8 != &local_798) {
      operator_delete(local_7a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_768._M_dataplus._M_p != &local_768.field_2) {
      operator_delete(local_768._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
      operator_delete(local_6e0._M_dataplus._M_p);
    }
    uVar19 = uVar19 + 1;
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"");
  local_7a8 = &local_798;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"");
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>();
  paVar2 = &local_b08.field_2;
  uVar19 = 0;
  while( true ) {
    sVar8 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar8 <= uVar19) break;
    pTVar11 = TreeDecomposition::getRelation
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         uVar19);
    std::operator+(&local_7c8,"\"",&pTVar11->_name);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_7c8);
    psVar15 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_b08.field_2._M_allocated_capacity = *psVar15;
      local_b08.field_2._8_8_ = plVar10[3];
      local_b08._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_b08.field_2._M_allocated_capacity = *psVar15;
      local_b08._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_b08._M_string_length = plVar10[1];
    *plVar10 = (long)psVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_6e0,(ulong)local_b08._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b08._M_dataplus._M_p != paVar2) {
      operator_delete(local_b08._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
      operator_delete(local_7c8._M_dataplus._M_p);
    }
    std::__cxx11::string::append((char *)&local_768);
    std::__cxx11::string::append((char *)&local_7a8);
    local_1d8 = uVar19;
    pTVar11 = TreeDecomposition::getRelation
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         uVar19);
    uVar19 = 0;
    do {
      if (((pTVar11->_bag).super__Base_bitset<2UL>._M_w[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0) {
        pAVar9 = TreeDecomposition::getAttribute
                           ((this->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            ,uVar19);
        Application::typeToStr_abi_cxx11_(&local_808,&this->super_Application,pAVar9->_type);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_808);
        local_b48._M_dataplus._M_p = (pointer)&local_b48.field_2;
        psVar15 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_b48.field_2._M_allocated_capacity = *psVar15;
          local_b48.field_2._8_8_ = plVar10[3];
        }
        else {
          local_b48.field_2._M_allocated_capacity = *psVar15;
          local_b48._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_b48._M_string_length = plVar10[1];
        *plVar10 = (long)psVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_b48,(ulong)(pAVar9->_name)._M_dataplus._M_p);
        local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
        psVar15 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_7c8.field_2._M_allocated_capacity = *psVar15;
          local_7c8.field_2._8_8_ = plVar10[3];
        }
        else {
          local_7c8.field_2._M_allocated_capacity = *psVar15;
          local_7c8._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_7c8._M_string_length = plVar10[1];
        *plVar10 = (long)psVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_7c8);
        psVar15 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_b08.field_2._M_allocated_capacity = *psVar15;
          local_b08.field_2._8_8_ = puVar12[3];
          local_b08._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_b08.field_2._M_allocated_capacity = *psVar15;
          local_b08._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_b08._M_string_length = puVar12[1];
        *puVar12 = psVar15;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_7a8,(ulong)local_b08._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b08._M_dataplus._M_p != paVar2) {
          operator_delete(local_b08._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b48._M_dataplus._M_p != &local_b48.field_2) {
          operator_delete(local_b48._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_808._M_dataplus._M_p != &local_808.field_2) {
          operator_delete(local_808._M_dataplus._M_p);
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != 100);
    std::__cxx11::string::pop_back();
    std::__cxx11::string::append((char *)&local_7a8);
    uVar19 = local_1d8 + 1;
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  local_ca8 = &local_c98;
  std::__cxx11::string::_M_construct((ulong)&local_ca8,'\0');
  puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_ca8);
  local_c28 = &local_c18;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_c18 = *puVar16;
    lStack_c10 = puVar12[3];
  }
  else {
    local_c18 = *puVar16;
    local_c28 = (ulong *)*puVar12;
  }
  local_c20 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)(puVar12 + 2) = 0;
  puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_c28);
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_bd8 = *puVar16;
    lStack_bd0 = puVar12[3];
    local_be8 = &local_bd8;
  }
  else {
    local_bd8 = *puVar16;
    local_be8 = (ulong *)*puVar12;
  }
  local_be0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)(puVar12 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_be8);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_b78 = *puVar16;
    lStack_b70 = plVar10[3];
    local_b88 = &local_b78;
  }
  else {
    local_b78 = *puVar16;
    local_b88 = (ulong *)*plVar10;
  }
  local_b80 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_b88);
  paVar3 = &local_ba8.field_2;
  psVar15 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_ba8.field_2._M_allocated_capacity = *psVar15;
    local_ba8.field_2._8_8_ = plVar10[3];
    local_ba8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_ba8.field_2._M_allocated_capacity = *psVar15;
    local_ba8._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_ba8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_ba8);
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  psVar15 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_808.field_2._M_allocated_capacity = *psVar15;
    local_808.field_2._8_8_ = plVar10[3];
  }
  else {
    local_808.field_2._M_allocated_capacity = *psVar15;
    local_808._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_808._M_string_length = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_808);
  psVar15 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_b48.field_2._M_allocated_capacity = *psVar15;
    local_b48.field_2._8_8_ = plVar10[3];
    local_b48._M_dataplus._M_p = (pointer)&local_b48.field_2;
  }
  else {
    local_b48.field_2._M_allocated_capacity = *psVar15;
    local_b48._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_b48._M_string_length = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_b48);
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  psVar15 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_7c8.field_2._M_allocated_capacity = *psVar15;
    local_7c8.field_2._8_8_ = plVar10[3];
  }
  else {
    local_7c8.field_2._M_allocated_capacity = *psVar15;
    local_7c8._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_7c8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_7c8);
  psVar15 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_b08.field_2._M_allocated_capacity = *psVar15;
    local_b08.field_2._8_8_ = plVar10[3];
    local_b08._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_b08.field_2._M_allocated_capacity = *psVar15;
    local_b08._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_b08._M_string_length = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48._M_dataplus._M_p != &local_b48.field_2) {
    operator_delete(local_b48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba8._M_dataplus._M_p != paVar3) {
    operator_delete(local_ba8._M_dataplus._M_p);
  }
  if (local_b88 != &local_b78) {
    operator_delete(local_b88);
  }
  if (local_be8 != &local_bd8) {
    operator_delete(local_be8);
  }
  if (local_c28 != &local_c18) {
    operator_delete(local_c28);
  }
  if (local_ca8 != &local_c98) {
    operator_delete(local_ca8);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,'\x03');
  plVar10 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x2a6b5e);
  local_1d0 = &local_1c0;
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_1c0 = *plVar13;
    lStack_1b8 = plVar10[3];
  }
  else {
    local_1c0 = *plVar13;
    local_1d0 = (long *)*plVar10;
  }
  local_1c8 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  local_1b0 = &local_1a0;
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_1a0 = *plVar13;
    lStack_198 = plVar10[3];
  }
  else {
    local_1a0 = *plVar13;
    local_1b0 = (long *)*plVar10;
  }
  local_1a8 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_2a0[0]);
  local_190 = &local_180;
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_180 = *plVar13;
    lStack_178 = plVar10[3];
  }
  else {
    local_180 = *plVar13;
    local_190 = (long *)*plVar10;
  }
  local_188 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_670 = *puVar16;
    lStack_668 = plVar10[3];
    local_680 = &local_670;
  }
  else {
    local_670 = *puVar16;
    local_680 = (ulong *)*plVar10;
  }
  local_678 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_380 = local_370;
  std::__cxx11::string::_M_construct((ulong)&local_380,'\x03');
  uVar19 = 0xf;
  if (local_680 != &local_670) {
    uVar19 = local_670;
  }
  if (uVar19 < (ulong)(local_378 + local_678)) {
    uVar19 = 0xf;
    if (local_380 != local_370) {
      uVar19 = local_370[0];
    }
    if (uVar19 < (ulong)(local_378 + local_678)) goto LAB_0016107c;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_380,0,(char *)0x0,(ulong)local_680);
  }
  else {
LAB_0016107c:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_680,(ulong)local_380);
  }
  local_360 = &local_350;
  puVar1 = puVar12 + 2;
  if ((undefined8 *)*puVar12 == puVar1) {
    local_350 = *puVar1;
    uStack_348 = puVar12[3];
  }
  else {
    local_350 = *puVar1;
    local_360 = (undefined8 *)*puVar12;
  }
  local_358 = puVar12[1];
  *puVar12 = puVar1;
  puVar12[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_360);
  local_170 = &local_160;
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_160 = *plVar13;
    lStack_158 = plVar10[3];
  }
  else {
    local_160 = *plVar13;
    local_170 = (long *)*plVar10;
  }
  local_168 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_7a8);
  local_150 = &local_140;
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_140 = *plVar13;
    lStack_138 = plVar10[3];
  }
  else {
    local_140 = *plVar13;
    local_150 = (long *)*plVar10;
  }
  local_148 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_650 = *puVar16;
    lStack_648 = plVar10[3];
    local_660 = &local_650;
  }
  else {
    local_650 = *puVar16;
    local_660 = (ulong *)*plVar10;
  }
  local_658 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_3a0 = local_390;
  std::__cxx11::string::_M_construct((ulong)&local_3a0,'\x03');
  uVar19 = 0xf;
  if (local_660 != &local_650) {
    uVar19 = local_650;
  }
  if (uVar19 < (ulong)(local_398 + local_658)) {
    uVar19 = 0xf;
    if (local_3a0 != local_390) {
      uVar19 = local_390[0];
    }
    if (uVar19 < (ulong)(local_398 + local_658)) goto LAB_00161299;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_3a0,0,(char *)0x0,(ulong)local_660);
  }
  else {
LAB_00161299:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_660,(ulong)local_3a0);
  }
  local_340 = &local_330;
  puVar1 = puVar12 + 2;
  if ((undefined8 *)*puVar12 == puVar1) {
    local_330 = *puVar1;
    uStack_328 = puVar12[3];
  }
  else {
    local_330 = *puVar1;
    local_340 = (undefined8 *)*puVar12;
  }
  local_338 = puVar12[1];
  *puVar12 = puVar1;
  puVar12[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_340);
  local_130 = &local_120;
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_120 = *plVar13;
    lStack_118 = plVar10[3];
  }
  else {
    local_120 = *plVar13;
    local_130 = (long *)*plVar10;
  }
  local_128 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_6c0[0]);
  local_110 = &local_100;
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_100 = *plVar13;
    lStack_f8 = plVar10[3];
  }
  else {
    local_100 = *plVar13;
    local_110 = (long *)*plVar10;
  }
  local_108 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_630 = *puVar16;
    lStack_628 = plVar10[3];
    local_640 = &local_630;
  }
  else {
    local_630 = *puVar16;
    local_640 = (ulong *)*plVar10;
  }
  local_638 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_3c0 = local_3b0;
  std::__cxx11::string::_M_construct((ulong)&local_3c0,'\x03');
  uVar19 = 0xf;
  if (local_640 != &local_630) {
    uVar19 = local_630;
  }
  if (uVar19 < (ulong)(local_3b8 + local_638)) {
    uVar19 = 0xf;
    if (local_3c0 != local_3b0) {
      uVar19 = local_3b0[0];
    }
    if (uVar19 < (ulong)(local_3b8 + local_638)) goto LAB_001614b6;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_3c0,0,(char *)0x0,(ulong)local_640);
  }
  else {
LAB_001614b6:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_640,(ulong)local_3c0);
  }
  local_320 = &local_310;
  puVar1 = puVar12 + 2;
  if ((undefined8 *)*puVar12 == puVar1) {
    local_310 = *puVar1;
    uStack_308 = puVar12[3];
  }
  else {
    local_310 = *puVar1;
    local_320 = (undefined8 *)*puVar12;
  }
  local_318 = puVar12[1];
  *puVar12 = puVar1;
  puVar12[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_320);
  local_f0 = &local_e0;
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_e0 = *plVar13;
    lStack_d8 = plVar10[3];
  }
  else {
    local_e0 = *plVar13;
    local_f0 = (long *)*plVar10;
  }
  local_e8 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_f0,(ulong)local_6e0._M_dataplus._M_p);
  local_d0 = &local_c0;
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_c0 = *plVar13;
    lStack_b8 = plVar10[3];
  }
  else {
    local_c0 = *plVar13;
    local_d0 = (long *)*plVar10;
  }
  local_c8 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_610 = *puVar16;
    lStack_608 = plVar10[3];
    local_620 = &local_610;
  }
  else {
    local_610 = *puVar16;
    local_620 = (ulong *)*plVar10;
  }
  local_618 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_3e0 = local_3d0;
  std::__cxx11::string::_M_construct((ulong)&local_3e0,'\x03');
  uVar19 = 0xf;
  if (local_620 != &local_610) {
    uVar19 = local_610;
  }
  if (uVar19 < (ulong)(local_3d8 + local_618)) {
    uVar19 = 0xf;
    if (local_3e0 != local_3d0) {
      uVar19 = local_3d0[0];
    }
    if (uVar19 < (ulong)(local_3d8 + local_618)) goto LAB_001616d3;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_3e0,0,(char *)0x0,(ulong)local_620);
  }
  else {
LAB_001616d3:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_620,(ulong)local_3e0);
  }
  local_300 = &local_2f0;
  puVar1 = puVar12 + 2;
  if ((undefined8 *)*puVar12 == puVar1) {
    local_2f0 = *puVar1;
    uStack_2e8 = puVar12[3];
  }
  else {
    local_2f0 = *puVar1;
    local_300 = (undefined8 *)*puVar12;
  }
  local_2f8 = puVar12[1];
  *puVar12 = puVar1;
  puVar12[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_300);
  local_b0 = &local_a0;
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_a0 = *plVar13;
    lStack_98 = plVar10[3];
  }
  else {
    local_a0 = *plVar13;
    local_b0 = (long *)*plVar10;
  }
  local_a8 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_b0,(ulong)local_768._M_dataplus._M_p);
  local_90 = &local_80;
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_80 = *plVar13;
    lStack_78 = plVar10[3];
  }
  else {
    local_80 = *plVar13;
    local_90 = (long *)*plVar10;
  }
  local_88 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_5f0 = *puVar16;
    lStack_5e8 = plVar10[3];
    local_600 = &local_5f0;
  }
  else {
    local_5f0 = *puVar16;
    local_600 = (ulong *)*plVar10;
  }
  local_5f8 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct((ulong)&local_400,'\x03');
  uVar19 = 0xf;
  if (local_600 != &local_5f0) {
    uVar19 = local_5f0;
  }
  if (uVar19 < (ulong)(local_3f8 + local_5f8)) {
    uVar19 = 0xf;
    if (local_400 != local_3f0) {
      uVar19 = local_3f0[0];
    }
    if (uVar19 < (ulong)(local_3f8 + local_5f8)) goto LAB_001618f0;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_400,0,(char *)0x0,(ulong)local_600);
  }
  else {
LAB_001618f0:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_600,(ulong)local_400);
  }
  local_2e0 = &local_2d0;
  puVar1 = puVar12 + 2;
  if ((undefined8 *)*puVar12 == puVar1) {
    local_2d0 = *puVar1;
    uStack_2c8 = puVar12[3];
  }
  else {
    local_2d0 = *puVar1;
    local_2e0 = (undefined8 *)*puVar12;
  }
  local_2d8 = puVar12[1];
  *puVar12 = puVar1;
  puVar12[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_5d0 = *puVar16;
    lStack_5c8 = plVar10[3];
    local_5e0 = &local_5d0;
  }
  else {
    local_5d0 = *puVar16;
    local_5e0 = (ulong *)*plVar10;
  }
  local_5d8 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_420 = local_410;
  std::__cxx11::string::_M_construct((ulong)&local_420,'\x06');
  uVar19 = 0xf;
  if (local_5e0 != &local_5d0) {
    uVar19 = local_5d0;
  }
  if (uVar19 < (ulong)(local_418 + local_5d8)) {
    uVar19 = 0xf;
    if (local_420 != local_410) {
      uVar19 = local_410[0];
    }
    if (uVar19 < (ulong)(local_418 + local_5d8)) goto LAB_00161a42;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_420,0,(char *)0x0,(ulong)local_5e0);
  }
  else {
LAB_00161a42:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5e0,(ulong)local_420);
  }
  local_2c0 = &local_2b0;
  puVar1 = puVar12 + 2;
  if ((undefined8 *)*puVar12 == puVar1) {
    local_2b0 = *puVar1;
    uStack_2a8 = puVar12[3];
  }
  else {
    local_2b0 = *puVar1;
    local_2c0 = (undefined8 *)*puVar12;
  }
  local_2b8 = puVar12[1];
  *puVar12 = puVar1;
  puVar12[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  local_70 = &local_60;
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_60 = *plVar13;
    lStack_58 = plVar10[3];
  }
  else {
    local_60 = *plVar13;
    local_70 = (long *)*plVar10;
  }
  local_68 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_5b0 = *puVar16;
    lStack_5a8 = plVar10[3];
    local_5c0 = &local_5b0;
  }
  else {
    local_5b0 = *puVar16;
    local_5c0 = (ulong *)*plVar10;
  }
  local_5b8 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_440 = local_430;
  std::__cxx11::string::_M_construct((ulong)&local_440,'\x03');
  uVar19 = 0xf;
  if (local_5c0 != &local_5b0) {
    uVar19 = local_5b0;
  }
  if (uVar19 < (ulong)(local_438 + local_5b8)) {
    uVar19 = 0xf;
    if (local_440 != local_430) {
      uVar19 = local_430[0];
    }
    if (uVar19 < (ulong)(local_438 + local_5b8)) goto LAB_00161bf5;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_440,0,(char *)0x0,(ulong)local_5c0);
  }
  else {
LAB_00161bf5:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5c0,(ulong)local_440);
  }
  local_788 = &local_778;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_778 = *puVar16;
    uStack_770 = puVar12[3];
  }
  else {
    local_778 = *puVar16;
    local_788 = (ulong *)*puVar12;
  }
  local_780 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_788);
  local_700 = &local_6f0;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_6f0 = *puVar16;
    lStack_6e8 = plVar10[3];
  }
  else {
    local_6f0 = *puVar16;
    local_700 = (ulong *)*plVar10;
  }
  local_6f8 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_700);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_7d8 = *puVar16;
    lStack_7d0 = plVar10[3];
    local_7e8 = &local_7d8;
  }
  else {
    local_7d8 = *puVar16;
    local_7e8 = (ulong *)*plVar10;
  }
  local_7e0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_460 = local_450;
  std::__cxx11::string::_M_construct((ulong)&local_460,'\x03');
  uVar19 = 0xf;
  if (local_7e8 != &local_7d8) {
    uVar19 = local_7d8;
  }
  if (uVar19 < (ulong)(local_458 + local_7e0)) {
    uVar19 = 0xf;
    if (local_460 != local_450) {
      uVar19 = local_450[0];
    }
    if (uVar19 < (ulong)(local_458 + local_7e0)) goto LAB_00161da8;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_460,0,(char *)0x0,(ulong)local_7e8);
  }
  else {
LAB_00161da8:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7e8,(ulong)local_460);
  }
  local_928 = &local_918;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_918 = *puVar16;
    uStack_910 = puVar12[3];
  }
  else {
    local_918 = *puVar16;
    local_928 = (ulong *)*puVar12;
  }
  local_920 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_928);
  local_888 = &local_878;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_878 = *puVar16;
    lStack_870 = plVar10[3];
  }
  else {
    local_878 = *puVar16;
    local_888 = (ulong *)*plVar10;
  }
  local_880 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_888);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_978 = *puVar16;
    lStack_970 = plVar10[3];
    local_988 = &local_978;
  }
  else {
    local_978 = *puVar16;
    local_988 = (ulong *)*plVar10;
  }
  local_980 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_480 = local_470;
  std::__cxx11::string::_M_construct((ulong)&local_480,'\x03');
  uVar19 = 0xf;
  if (local_988 != &local_978) {
    uVar19 = local_978;
  }
  if (uVar19 < (ulong)(local_478 + local_980)) {
    uVar19 = 0xf;
    if (local_480 != local_470) {
      uVar19 = local_470[0];
    }
    if (uVar19 < (ulong)(local_478 + local_980)) goto LAB_00161f5b;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_480,0,(char *)0x0,(ulong)local_988);
  }
  else {
LAB_00161f5b:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_988,(ulong)local_480);
  }
  local_908 = &local_8f8;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_8f8 = *puVar16;
    uStack_8f0 = puVar12[3];
  }
  else {
    local_8f8 = *puVar16;
    local_908 = (ulong *)*puVar12;
  }
  local_900 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_908);
  local_9c8 = &local_9b8;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_9b8 = *puVar16;
    lStack_9b0 = plVar10[3];
  }
  else {
    local_9b8 = *puVar16;
    local_9c8 = (ulong *)*plVar10;
  }
  local_9c0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  sVar8 = TreeDecomposition::numberOfRelations
                    ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  cVar20 = '\x01';
  if (9 < sVar8) {
    sVar17 = sVar8;
    cVar7 = '\x04';
    do {
      cVar20 = cVar7;
      if (sVar17 < 100) {
        cVar20 = cVar20 + -2;
        goto LAB_001620a9;
      }
      if (sVar17 < 1000) {
        cVar20 = cVar20 + -1;
        goto LAB_001620a9;
      }
      if (sVar17 < 10000) goto LAB_001620a9;
      bVar5 = 99999 < sVar17;
      sVar17 = sVar17 / 10000;
      cVar7 = cVar20 + '\x04';
    } while (bVar5);
    cVar20 = cVar20 + '\x01';
  }
LAB_001620a9:
  local_6a0 = local_690;
  std::__cxx11::string::_M_construct((ulong)&local_6a0,cVar20);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_6a0,local_698,sVar8);
  uVar19 = CONCAT44(uStack_694,local_698) + local_9c0;
  uVar18 = 0xf;
  if (local_9c8 != &local_9b8) {
    uVar18 = local_9b8;
  }
  if (uVar18 < uVar19) {
    uVar18 = 0xf;
    if (local_6a0 != local_690) {
      uVar18 = local_690[0];
    }
    if (uVar18 < uVar19) goto LAB_00162134;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_6a0,0,(char *)0x0,(ulong)local_9c8);
  }
  else {
LAB_00162134:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9c8,(ulong)local_6a0);
  }
  local_8e8 = &local_8d8;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_8d8 = *puVar16;
    uStack_8d0 = puVar12[3];
  }
  else {
    local_8d8 = *puVar16;
    local_8e8 = (ulong *)*puVar12;
  }
  local_8e0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_8e8);
  local_8c8 = &local_8b8;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_8b8 = *puVar16;
    lStack_8b0 = plVar10[3];
  }
  else {
    local_8b8 = *puVar16;
    local_8c8 = (ulong *)*plVar10;
  }
  local_8c0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_4a0 = local_490;
  std::__cxx11::string::_M_construct((ulong)&local_4a0,'\x03');
  uVar19 = 0xf;
  if (local_8c8 != &local_8b8) {
    uVar19 = local_8b8;
  }
  if (uVar19 < (ulong)(local_498 + local_8c0)) {
    uVar19 = 0xf;
    if (local_4a0 != local_490) {
      uVar19 = local_490[0];
    }
    if (uVar19 < (ulong)(local_498 + local_8c0)) goto LAB_0016228e;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_4a0,0,(char *)0x0,(ulong)local_8c8);
  }
  else {
LAB_0016228e:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8c8,(ulong)local_4a0);
  }
  local_828 = &local_818;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_818 = *puVar16;
    uStack_810 = puVar12[3];
  }
  else {
    local_818 = *puVar16;
    local_828 = (ulong *)*puVar12;
  }
  local_820 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_828);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_858 = *puVar16;
    lStack_850 = plVar10[3];
    local_868 = &local_858;
  }
  else {
    local_858 = *puVar16;
    local_868 = (ulong *)*plVar10;
  }
  local_860 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_4c0 = local_4b0;
  std::__cxx11::string::_M_construct((ulong)&local_4c0,'\x06');
  uVar19 = 0xf;
  if (local_868 != &local_858) {
    uVar19 = local_858;
  }
  if (uVar19 < (ulong)(local_4b8 + local_860)) {
    uVar19 = 0xf;
    if (local_4c0 != local_4b0) {
      uVar19 = local_4b0[0];
    }
    if (uVar19 < (ulong)(local_4b8 + local_860)) goto LAB_001623e0;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_4c0,0,(char *)0x0,(ulong)local_868);
  }
  else {
LAB_001623e0:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_868,(ulong)local_4c0);
  }
  local_cc8 = &local_cb8;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_cb8 = *puVar16;
    lStack_cb0 = puVar12[3];
  }
  else {
    local_cb8 = *puVar16;
    local_cc8 = (ulong *)*puVar12;
  }
  local_cc0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_cc8);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_838 = *puVar16;
    lStack_830 = plVar10[3];
    local_848 = &local_838;
  }
  else {
    local_838 = *puVar16;
    local_848 = (ulong *)*plVar10;
  }
  local_840 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_4e0 = local_4d0;
  std::__cxx11::string::_M_construct((ulong)&local_4e0,'\x06');
  uVar19 = 0xf;
  if (local_848 != &local_838) {
    uVar19 = local_838;
  }
  if (uVar19 < (ulong)(local_4d8 + local_840)) {
    uVar19 = 0xf;
    if (local_4e0 != local_4d0) {
      uVar19 = local_4d0[0];
    }
    if (uVar19 < (ulong)(local_4d8 + local_840)) goto LAB_00162523;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_4e0,0,(char *)0x0,(ulong)local_848);
  }
  else {
LAB_00162523:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_848,(ulong)local_4e0);
  }
  local_968 = &local_958;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_958 = *puVar16;
    lStack_950 = puVar12[3];
  }
  else {
    local_958 = *puVar16;
    local_968 = (ulong *)*puVar12;
  }
  local_960 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_968);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_ad8 = *puVar16;
    lStack_ad0 = plVar10[3];
    local_ae8 = &local_ad8;
  }
  else {
    local_ad8 = *puVar16;
    local_ae8 = (ulong *)*plVar10;
  }
  local_ae0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_500 = local_4f0;
  std::__cxx11::string::_M_construct((ulong)&local_500,'\t');
  uVar19 = 0xf;
  if (local_ae8 != &local_ad8) {
    uVar19 = local_ad8;
  }
  if (uVar19 < (ulong)(local_4f8 + local_ae0)) {
    uVar19 = 0xf;
    if (local_500 != local_4f0) {
      uVar19 = local_4f0[0];
    }
    if (uVar19 < (ulong)(local_4f8 + local_ae0)) goto LAB_00162675;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_500,0,(char *)0x0,(ulong)local_ae8);
  }
  else {
LAB_00162675:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_ae8,(ulong)local_500);
  }
  local_a68 = &local_a58;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_a58 = *puVar16;
    lStack_a50 = puVar12[3];
  }
  else {
    local_a58 = *puVar16;
    local_a68 = (ulong *)*puVar12;
  }
  local_a60 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_a68);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_ab8 = *puVar16;
    lStack_ab0 = plVar10[3];
    local_ac8 = &local_ab8;
  }
  else {
    local_ab8 = *puVar16;
    local_ac8 = (ulong *)*plVar10;
  }
  local_ac0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_520 = local_510;
  std::__cxx11::string::_M_construct((ulong)&local_520,'\t');
  uVar19 = 0xf;
  if (local_ac8 != &local_ab8) {
    uVar19 = local_ab8;
  }
  if (uVar19 < (ulong)(local_518 + local_ac0)) {
    uVar19 = 0xf;
    if (local_520 != local_510) {
      uVar19 = local_510[0];
    }
    if (uVar19 < (ulong)(local_518 + local_ac0)) goto LAB_001627c7;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_520,0,(char *)0x0,(ulong)local_ac8);
  }
  else {
LAB_001627c7:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_ac8,(ulong)local_520);
  }
  local_a48 = &local_a38;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_a38 = *puVar16;
    lStack_a30 = puVar12[3];
  }
  else {
    local_a38 = *puVar16;
    local_a48 = (ulong *)*puVar12;
  }
  local_a40 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_a48);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_9f8 = *puVar16;
    lStack_9f0 = plVar10[3];
    local_a08 = &local_9f8;
  }
  else {
    local_9f8 = *puVar16;
    local_a08 = (ulong *)*plVar10;
  }
  local_a00 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_540 = local_530;
  std::__cxx11::string::_M_construct((ulong)&local_540,'\t');
  uVar19 = 0xf;
  if (local_a08 != &local_9f8) {
    uVar19 = local_9f8;
  }
  if (uVar19 < (ulong)(local_538 + local_a00)) {
    uVar19 = 0xf;
    if (local_540 != local_530) {
      uVar19 = local_530[0];
    }
    if (uVar19 < (ulong)(local_538 + local_a00)) goto LAB_00162919;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_540,0,(char *)0x0,(ulong)local_a08);
  }
  else {
LAB_00162919:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a08,(ulong)local_540);
  }
  local_948 = &local_938;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_938 = *puVar16;
    lStack_930 = puVar12[3];
  }
  else {
    local_938 = *puVar16;
    local_948 = (ulong *)*puVar12;
  }
  local_940 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_948);
  local_a28 = &local_a18;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_a18 = *puVar16;
    lStack_a10 = plVar10[3];
  }
  else {
    local_a18 = *puVar16;
    local_a28 = (ulong *)*plVar10;
  }
  local_a20 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_a28);
  local_9e8 = &local_9d8;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_9d8 = *puVar16;
    lStack_9d0 = plVar10[3];
  }
  else {
    local_9d8 = *puVar16;
    local_9e8 = (ulong *)*plVar10;
  }
  local_9e0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_9e8);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_a98 = *puVar16;
    lStack_a90 = plVar10[3];
    local_aa8 = &local_a98;
  }
  else {
    local_a98 = *puVar16;
    local_aa8 = (ulong *)*plVar10;
  }
  local_aa0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_560 = local_550;
  std::__cxx11::string::_M_construct((ulong)&local_560,'\x06');
  uVar19 = 0xf;
  if (local_aa8 != &local_a98) {
    uVar19 = local_a98;
  }
  if (uVar19 < (ulong)(local_558 + local_aa0)) {
    uVar19 = 0xf;
    if (local_560 != local_550) {
      uVar19 = local_550[0];
    }
    if (uVar19 < (ulong)(local_558 + local_aa0)) goto LAB_00162b2d;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_560,0,(char *)0x0,(ulong)local_aa8);
  }
  else {
LAB_00162b2d:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_aa8,(ulong)local_560);
  }
  local_8a8 = &local_898;
  plVar10 = puVar12 + 2;
  if ((long *)*puVar12 == plVar10) {
    local_898 = *plVar10;
    lStack_890 = puVar12[3];
  }
  else {
    local_898 = *plVar10;
    local_8a8 = (long *)*puVar12;
  }
  local_8a0 = puVar12[1];
  *puVar12 = plVar10;
  puVar12[1] = 0;
  *(undefined1 *)plVar10 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_8a8);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_998 = *puVar16;
    lStack_990 = plVar10[3];
    local_9a8 = &local_998;
  }
  else {
    local_998 = *puVar16;
    local_9a8 = (ulong *)*plVar10;
  }
  local_9a0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_580 = local_570;
  std::__cxx11::string::_M_construct((ulong)&local_580,'\x06');
  uVar19 = 0xf;
  if (local_9a8 != &local_998) {
    uVar19 = local_998;
  }
  if (uVar19 < (ulong)(local_578 + local_9a0)) {
    uVar19 = 0xf;
    if (local_580 != local_570) {
      uVar19 = local_570[0];
    }
    if (uVar19 < (ulong)(local_578 + local_9a0)) goto LAB_00162c7f;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_580,0,(char *)0x0,(ulong)local_9a8);
  }
  else {
LAB_00162c7f:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9a8,(ulong)local_580);
  }
  local_a88 = &local_a78;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_a78 = *puVar16;
    lStack_a70 = puVar12[3];
  }
  else {
    local_a78 = *puVar16;
    local_a88 = (ulong *)*puVar12;
  }
  local_a80 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_a88);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_b18 = *puVar16;
    lStack_b10 = plVar10[3];
    local_b28 = &local_b18;
  }
  else {
    local_b18 = *puVar16;
    local_b28 = (ulong *)*plVar10;
  }
  local_b20 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_5a0 = local_590;
  std::__cxx11::string::_M_construct((ulong)&local_5a0,'\x06');
  uVar19 = 0xf;
  if (local_b28 != &local_b18) {
    uVar19 = local_b18;
  }
  if (uVar19 < (ulong)(local_598 + local_b20)) {
    uVar19 = 0xf;
    if (local_5a0 != local_590) {
      uVar19 = local_590[0];
    }
    if (uVar19 < (ulong)(local_598 + local_b20)) goto LAB_00162dd1;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_5a0,0,(char *)0x0,(ulong)local_b28);
  }
  else {
LAB_00162dd1:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b28,(ulong)local_5a0);
  }
  local_b68 = &local_b58;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_b58 = *puVar16;
    lStack_b50 = puVar12[3];
  }
  else {
    local_b58 = *puVar16;
    local_b68 = (ulong *)*puVar12;
  }
  local_b60 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_b68);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_bb8 = *puVar16;
    lStack_bb0 = plVar10[3];
    local_bc8 = &local_bb8;
  }
  else {
    local_bb8 = *puVar16;
    local_bc8 = (ulong *)*plVar10;
  }
  local_bc0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct((ulong)&local_200,'\t');
  uVar19 = 0xf;
  if (local_bc8 != &local_bb8) {
    uVar19 = local_bb8;
  }
  if (uVar19 < (ulong)(local_1f8 + local_bc0)) {
    uVar19 = 0xf;
    if (local_200 != local_1f0) {
      uVar19 = local_1f0[0];
    }
    if (uVar19 < (ulong)(local_1f8 + local_bc0)) goto LAB_00162f23;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_bc8);
  }
  else {
LAB_00162f23:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_bc8,(ulong)local_200);
  }
  local_c08._M_dataplus._M_p = (pointer)&local_c08.field_2;
  puVar16 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar16) {
    local_c08.field_2._M_allocated_capacity = *puVar16;
    local_c08.field_2._8_8_ = puVar12[3];
  }
  else {
    local_c08.field_2._M_allocated_capacity = *puVar16;
    local_c08._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_c08._M_string_length = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_c08);
  local_c48._M_dataplus._M_p = (pointer)&local_c48.field_2;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar16) {
    local_c48.field_2._M_allocated_capacity = *puVar16;
    local_c48.field_2._8_8_ = plVar10[3];
  }
  else {
    local_c48.field_2._M_allocated_capacity = *puVar16;
    local_c48._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_c48._M_string_length = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_c48);
  local_c68 = &local_c58;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_c58 = *puVar16;
    lStack_c50 = plVar10[3];
  }
  else {
    local_c58 = *puVar16;
    local_c68 = (ulong *)*plVar10;
  }
  local_c60 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_c68);
  local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar16) {
    local_c88.field_2._M_allocated_capacity = *puVar16;
    local_c88.field_2._8_8_ = plVar10[3];
  }
  else {
    local_c88.field_2._M_allocated_capacity = *puVar16;
    local_c88._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_c88._M_string_length = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_220 = local_210;
  std::__cxx11::string::_M_construct((ulong)&local_220,'\x06');
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    uVar21 = local_c88.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_218 + local_c88._M_string_length) {
    uVar19 = 0xf;
    if (local_220 != local_210) {
      uVar19 = local_210[0];
    }
    if (uVar19 < local_218 + local_c88._M_string_length) goto LAB_00163121;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_220,0,(char *)0x0,(ulong)local_c88._M_dataplus._M_p);
  }
  else {
LAB_00163121:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c88,(ulong)local_220);
  }
  local_ca8 = &local_c98;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_c98 = *puVar16;
    lStack_c90 = puVar12[3];
  }
  else {
    local_c98 = *puVar16;
    local_ca8 = (ulong *)*puVar12;
  }
  local_ca0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_ca8);
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_c18 = *puVar16;
    lStack_c10 = puVar12[3];
    local_c28 = &local_c18;
  }
  else {
    local_c18 = *puVar16;
    local_c28 = (ulong *)*puVar12;
  }
  local_c20 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)(puVar12 + 2) = 0;
  local_240 = local_230;
  std::__cxx11::string::_M_construct((ulong)&local_240,'\x03');
  uVar19 = 0xf;
  if (local_c28 != &local_c18) {
    uVar19 = local_c18;
  }
  if (uVar19 < (ulong)(local_238 + local_c20)) {
    uVar19 = 0xf;
    if (local_240 != local_230) {
      uVar19 = local_230[0];
    }
    if (uVar19 < (ulong)(local_238 + local_c20)) goto LAB_00163267;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,(ulong)local_c28);
  }
  else {
LAB_00163267:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c28,(ulong)local_240);
  }
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_bd8 = *puVar16;
    lStack_bd0 = puVar12[3];
    local_be8 = &local_bd8;
  }
  else {
    local_bd8 = *puVar16;
    local_be8 = (ulong *)*puVar12;
  }
  local_be0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_be8);
  local_b88 = &local_b78;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_b78 = *puVar16;
    lStack_b70 = plVar10[3];
  }
  else {
    local_b78 = *puVar16;
    local_b88 = (ulong *)*plVar10;
  }
  local_b80 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_260 = local_250;
  std::__cxx11::string::_M_construct((ulong)&local_260,'\x03');
  uVar19 = 0xf;
  if (local_b88 != &local_b78) {
    uVar19 = local_b78;
  }
  if (uVar19 < (ulong)(local_258 + local_b80)) {
    uVar19 = 0xf;
    if (local_260 != local_250) {
      uVar19 = local_250[0];
    }
    if (uVar19 < (ulong)(local_258 + local_b80)) goto LAB_001633c3;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_b88);
  }
  else {
LAB_001633c3:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b88,(ulong)local_260);
  }
  psVar15 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_ba8.field_2._M_allocated_capacity = *psVar15;
    local_ba8.field_2._8_8_ = puVar12[3];
    local_ba8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_ba8.field_2._M_allocated_capacity = *psVar15;
    local_ba8._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_ba8._M_string_length = puVar12[1];
  *puVar12 = psVar15;
  puVar12[1] = 0;
  *(undefined1 *)psVar15 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_ba8);
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar16) {
    local_808.field_2._M_allocated_capacity = *puVar16;
    local_808.field_2._8_8_ = plVar10[3];
  }
  else {
    local_808.field_2._M_allocated_capacity = *puVar16;
    local_808._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_808._M_string_length = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_280 = local_270;
  std::__cxx11::string::_M_construct((ulong)&local_280,'\x03');
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    uVar21 = local_808.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_278 + local_808._M_string_length) {
    uVar19 = 0xf;
    if (local_280 != local_270) {
      uVar19 = local_270[0];
    }
    if (uVar19 < local_278 + local_808._M_string_length) goto LAB_0016351e;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_280,0,(char *)0x0,(ulong)local_808._M_dataplus._M_p);
  }
  else {
LAB_0016351e:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_808,(ulong)local_280);
  }
  local_b48._M_dataplus._M_p = (pointer)&local_b48.field_2;
  psVar15 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_b48.field_2._M_allocated_capacity = *psVar15;
    local_b48.field_2._8_8_ = puVar12[3];
  }
  else {
    local_b48.field_2._M_allocated_capacity = *psVar15;
    local_b48._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_b48._M_string_length = puVar12[1];
  *puVar12 = psVar15;
  puVar12[1] = 0;
  *(undefined1 *)psVar15 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_b48);
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  psVar15 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_7c8.field_2._M_allocated_capacity = *psVar15;
    local_7c8.field_2._8_8_ = plVar10[3];
  }
  else {
    local_7c8.field_2._M_allocated_capacity = *psVar15;
    local_7c8._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_7c8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48._M_dataplus._M_p != &local_b48.field_2) {
    operator_delete(local_b48._M_dataplus._M_p);
  }
  if (local_280 != local_270) {
    operator_delete(local_280);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
    operator_delete(local_ba8._M_dataplus._M_p);
  }
  if (local_260 != local_250) {
    operator_delete(local_260);
  }
  if (local_b88 != &local_b78) {
    operator_delete(local_b88);
  }
  if (local_be8 != &local_bd8) {
    operator_delete(local_be8);
  }
  if (local_240 != local_230) {
    operator_delete(local_240);
  }
  if (local_c28 != &local_c18) {
    operator_delete(local_c28);
  }
  if (local_ca8 != &local_c98) {
    operator_delete(local_ca8);
  }
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    operator_delete(local_c88._M_dataplus._M_p);
  }
  if (local_c68 != &local_c58) {
    operator_delete(local_c68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
    operator_delete(local_c48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
    operator_delete(local_c08._M_dataplus._M_p);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200);
  }
  if (local_bc8 != &local_bb8) {
    operator_delete(local_bc8);
  }
  if (local_b68 != &local_b58) {
    operator_delete(local_b68);
  }
  if (local_5a0 != local_590) {
    operator_delete(local_5a0);
  }
  if (local_b28 != &local_b18) {
    operator_delete(local_b28);
  }
  if (local_a88 != &local_a78) {
    operator_delete(local_a88);
  }
  if (local_580 != local_570) {
    operator_delete(local_580);
  }
  if (local_9a8 != &local_998) {
    operator_delete(local_9a8);
  }
  if (local_8a8 != &local_898) {
    operator_delete(local_8a8);
  }
  if (local_560 != local_550) {
    operator_delete(local_560);
  }
  if (local_aa8 != &local_a98) {
    operator_delete(local_aa8);
  }
  if (local_9e8 != &local_9d8) {
    operator_delete(local_9e8);
  }
  if (local_a28 != &local_a18) {
    operator_delete(local_a28);
  }
  if (local_948 != &local_938) {
    operator_delete(local_948);
  }
  if (local_540 != local_530) {
    operator_delete(local_540);
  }
  if (local_a08 != &local_9f8) {
    operator_delete(local_a08);
  }
  if (local_a48 != &local_a38) {
    operator_delete(local_a48);
  }
  if (local_520 != local_510) {
    operator_delete(local_520);
  }
  if (local_ac8 != &local_ab8) {
    operator_delete(local_ac8);
  }
  if (local_a68 != &local_a58) {
    operator_delete(local_a68);
  }
  if (local_500 != local_4f0) {
    operator_delete(local_500);
  }
  if (local_ae8 != &local_ad8) {
    operator_delete(local_ae8);
  }
  if (local_968 != &local_958) {
    operator_delete(local_968);
  }
  if (local_4e0 != local_4d0) {
    operator_delete(local_4e0);
  }
  if (local_848 != &local_838) {
    operator_delete(local_848);
  }
  if (local_cc8 != &local_cb8) {
    operator_delete(local_cc8);
  }
  if (local_4c0 != local_4b0) {
    operator_delete(local_4c0);
  }
  if (local_868 != &local_858) {
    operator_delete(local_868);
  }
  if (local_828 != &local_818) {
    operator_delete(local_828);
  }
  if (local_4a0 != local_490) {
    operator_delete(local_4a0);
  }
  if (local_8c8 != &local_8b8) {
    operator_delete(local_8c8);
  }
  if (local_8e8 != &local_8d8) {
    operator_delete(local_8e8);
  }
  if (local_6a0 != local_690) {
    operator_delete(local_6a0);
  }
  if (local_9c8 != &local_9b8) {
    operator_delete(local_9c8);
  }
  if (local_908 != &local_8f8) {
    operator_delete(local_908);
  }
  if (local_480 != local_470) {
    operator_delete(local_480);
  }
  if (local_988 != &local_978) {
    operator_delete(local_988);
  }
  if (local_888 != &local_878) {
    operator_delete(local_888);
  }
  if (local_928 != &local_918) {
    operator_delete(local_928);
  }
  if (local_460 != local_450) {
    operator_delete(local_460);
  }
  if (local_7e8 != &local_7d8) {
    operator_delete(local_7e8);
  }
  if (local_700 != &local_6f0) {
    operator_delete(local_700);
  }
  if (local_788 != &local_778) {
    operator_delete(local_788);
  }
  if (local_440 != local_430) {
    operator_delete(local_440);
  }
  if (local_5c0 != &local_5b0) {
    operator_delete(local_5c0);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0);
  }
  if (local_420 != local_410) {
    operator_delete(local_420);
  }
  if (local_5e0 != &local_5d0) {
    operator_delete(local_5e0);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0);
  }
  if (local_400 != local_3f0) {
    operator_delete(local_400);
  }
  if (local_600 != &local_5f0) {
    operator_delete(local_600);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300);
  }
  if (local_3e0 != local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_620 != &local_610) {
    operator_delete(local_620);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320);
  }
  if (local_3c0 != local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_640 != &local_630) {
    operator_delete(local_640);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340);
  }
  if (local_3a0 != local_390) {
    operator_delete(local_3a0);
  }
  if (local_660 != &local_650) {
    operator_delete(local_660);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360);
  }
  if (local_380 != local_370) {
    operator_delete(local_380);
  }
  if (local_680 != &local_670) {
    operator_delete(local_680);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  local_b48._M_dataplus._M_p = (pointer)&local_b48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b48,"");
  local_ba8._M_dataplus._M_p = (pointer)&local_ba8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_ba8,'\t');
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_ba8);
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  psVar15 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_808.field_2._M_allocated_capacity = *psVar15;
    local_808.field_2._8_8_ = plVar10[3];
  }
  else {
    local_808.field_2._M_allocated_capacity = *psVar15;
    local_808._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_808._M_string_length = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
    operator_delete(local_ba8._M_dataplus._M_p);
  }
  uVar19 = 0;
  while( true ) {
    sVar8 = TreeDecomposition::numberOfAttributes
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar8 <= uVar19) break;
    pAVar9 = TreeDecomposition::getAttribute
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar19);
    local_c68 = &local_c58;
    std::__cxx11::string::_M_construct((ulong)&local_c68,'\f');
    puVar12 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_c68,0,(char *)0x0,0x2b2de1);
    local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
    puVar16 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_c88.field_2._M_allocated_capacity = *puVar16;
      local_c88.field_2._8_8_ = puVar12[3];
    }
    else {
      local_c88.field_2._M_allocated_capacity = *puVar16;
      local_c88._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_c88._M_string_length = puVar12[1];
    *puVar12 = puVar16;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_c88);
    local_ca8 = &local_c98;
    puVar16 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar16) {
      local_c98 = *puVar16;
      lStack_c90 = plVar10[3];
    }
    else {
      local_c98 = *puVar16;
      local_ca8 = (ulong *)*plVar10;
    }
    local_ca0 = plVar10[1];
    *plVar10 = (long)puVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    Application::typeToStr_abi_cxx11_(&local_c48,&this->super_Application,pAVar9->_type);
    uVar18 = 0xf;
    if (local_ca8 != &local_c98) {
      uVar18 = local_c98;
    }
    if (uVar18 < local_c48._M_string_length + local_ca0) {
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
        uVar21 = local_c48.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_c48._M_string_length + local_ca0) goto LAB_001640f8;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_c48,0,(char *)0x0,(ulong)local_ca8);
    }
    else {
LAB_001640f8:
      puVar12 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_ca8,(ulong)local_c48._M_dataplus._M_p);
    }
    local_c28 = &local_c18;
    puVar16 = puVar12 + 2;
    if ((ulong *)*puVar12 == puVar16) {
      local_c18 = *puVar16;
      lStack_c10 = puVar12[3];
    }
    else {
      local_c18 = *puVar16;
      local_c28 = (ulong *)*puVar12;
    }
    local_c20 = puVar12[1];
    *puVar12 = puVar16;
    puVar12[1] = 0;
    *(undefined1 *)puVar16 = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_c28);
    local_be8 = &local_bd8;
    puVar16 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar16) {
      local_bd8 = *puVar16;
      lStack_bd0 = plVar10[3];
    }
    else {
      local_bd8 = *puVar16;
      local_be8 = (ulong *)*plVar10;
    }
    local_be0 = plVar10[1];
    *plVar10 = (long)puVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_be8,(ulong)(pAVar9->_name)._M_dataplus._M_p);
    local_b88 = &local_b78;
    puVar16 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar16) {
      local_b78 = *puVar16;
      lStack_b70 = plVar10[3];
    }
    else {
      local_b78 = *puVar16;
      local_b88 = (ulong *)*plVar10;
    }
    local_b80 = plVar10[1];
    *plVar10 = (long)puVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_b88);
    local_ba8._M_dataplus._M_p = (pointer)&local_ba8.field_2;
    psVar15 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_ba8.field_2._M_allocated_capacity = *psVar15;
      local_ba8.field_2._8_8_ = plVar10[3];
    }
    else {
      local_ba8.field_2._M_allocated_capacity = *psVar15;
      local_ba8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_ba8._M_string_length = plVar10[1];
    *plVar10 = (long)psVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_808,(ulong)local_ba8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
      operator_delete(local_ba8._M_dataplus._M_p);
    }
    if (local_b88 != &local_b78) {
      operator_delete(local_b88);
    }
    if (local_be8 != &local_bd8) {
      operator_delete(local_be8);
    }
    if (local_c28 != &local_c18) {
      operator_delete(local_c28);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
      operator_delete(local_c48._M_dataplus._M_p);
    }
    if (local_ca8 != &local_c98) {
      operator_delete(local_ca8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
      operator_delete(local_c88._M_dataplus._M_p);
    }
    if (local_c68 != &local_c58) {
      operator_delete(local_c68);
    }
    local_ca8 = &local_c98;
    std::__cxx11::string::_M_construct((ulong)&local_ca8,'\x03');
    Application::typeToStr_abi_cxx11_(&local_c88,&this->super_Application,pAVar9->_type);
    uVar18 = 0xf;
    if (local_ca8 != &local_c98) {
      uVar18 = local_c98;
    }
    if (uVar18 < local_c88._M_string_length + local_ca0) {
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
        uVar21 = local_c88.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_c88._M_string_length + local_ca0) goto LAB_00164402;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_c88,0,(char *)0x0,(ulong)local_ca8);
    }
    else {
LAB_00164402:
      puVar12 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_ca8,(ulong)local_c88._M_dataplus._M_p);
    }
    local_c28 = &local_c18;
    puVar16 = puVar12 + 2;
    if ((ulong *)*puVar12 == puVar16) {
      local_c18 = *puVar16;
      lStack_c10 = puVar12[3];
    }
    else {
      local_c18 = *puVar16;
      local_c28 = (ulong *)*puVar12;
    }
    local_c20 = puVar12[1];
    *puVar12 = puVar16;
    puVar12[1] = 0;
    *(undefined1 *)puVar16 = 0;
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_c28);
    local_be8 = &local_bd8;
    puVar16 = puVar12 + 2;
    if ((ulong *)*puVar12 == puVar16) {
      local_bd8 = *puVar16;
      lStack_bd0 = puVar12[3];
    }
    else {
      local_bd8 = *puVar16;
      local_be8 = (ulong *)*puVar12;
    }
    local_be0 = puVar12[1];
    *puVar12 = puVar16;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    puVar12 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_be8,(ulong)(pAVar9->_name)._M_dataplus._M_p);
    puVar16 = puVar12 + 2;
    if ((ulong *)*puVar12 == puVar16) {
      local_b78 = *puVar16;
      lStack_b70 = puVar12[3];
      local_b88 = &local_b78;
    }
    else {
      local_b78 = *puVar16;
      local_b88 = (ulong *)*puVar12;
    }
    local_b80 = puVar12[1];
    *puVar12 = puVar16;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_b88);
    local_ba8._M_dataplus._M_p = (pointer)&local_ba8.field_2;
    psVar15 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_ba8.field_2._M_allocated_capacity = *psVar15;
      local_ba8.field_2._8_8_ = plVar10[3];
    }
    else {
      local_ba8.field_2._M_allocated_capacity = *psVar15;
      local_ba8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_ba8._M_string_length = plVar10[1];
    *plVar10 = (long)psVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_b48,(ulong)local_ba8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
      operator_delete(local_ba8._M_dataplus._M_p);
    }
    if (local_b88 != &local_b78) {
      operator_delete(local_b88);
    }
    if (local_be8 != &local_bd8) {
      operator_delete(local_be8);
    }
    if (local_c28 != &local_c18) {
      operator_delete(local_c28);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
      operator_delete(local_c88._M_dataplus._M_p);
    }
    if (local_ca8 != &local_c98) {
      operator_delete(local_ca8);
    }
    uVar19 = uVar19 + 1;
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  local_be8 = &local_bd8;
  std::__cxx11::string::_M_construct((ulong)&local_be8,'\f');
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_be8,0,(char *)0x0,0x2a6240);
  paVar2 = &local_ba8.field_2;
  local_b88 = &local_b78;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_b78 = *puVar16;
    lStack_b70 = plVar10[3];
  }
  else {
    local_b78 = *puVar16;
    local_b88 = (ulong *)*plVar10;
  }
  local_b80 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_b88);
  psVar15 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_ba8.field_2._M_allocated_capacity = *psVar15;
    local_ba8.field_2._8_8_ = plVar10[3];
    local_ba8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_ba8.field_2._M_allocated_capacity = *psVar15;
    local_ba8._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_ba8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_808,(ulong)local_ba8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba8._M_dataplus._M_p != paVar2) {
    operator_delete(local_ba8._M_dataplus._M_p);
  }
  if (local_b88 != &local_b78) {
    operator_delete(local_b88);
  }
  if (local_be8 != &local_bd8) {
    operator_delete(local_be8);
  }
  std::operator+(&local_c48,"\nstruct Test_tuple\n{\n",&local_b48);
  local_c08._M_dataplus._M_p = (pointer)&local_c08.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_c08,'\x03');
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
    uVar21 = local_c48.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_c08._M_string_length + local_c48._M_string_length) {
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
      uVar21 = local_c08.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < local_c08._M_string_length + local_c48._M_string_length) goto LAB_0016487f;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_c08,0,(char *)0x0,(ulong)local_c48._M_dataplus._M_p);
  }
  else {
LAB_0016487f:
    puVar12 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_c48,(ulong)local_c08._M_dataplus._M_p);
  }
  local_c68 = &local_c58;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_c58 = *puVar16;
    lStack_c50 = puVar12[3];
  }
  else {
    local_c58 = *puVar16;
    local_c68 = (ulong *)*puVar12;
  }
  local_c60 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_c68);
  local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar16) {
    local_c88.field_2._M_allocated_capacity = *puVar16;
    local_c88.field_2._8_8_ = plVar10[3];
  }
  else {
    local_c88.field_2._M_allocated_capacity = *puVar16;
    local_c88._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_c88._M_string_length = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_bc8 = &local_bb8;
  std::__cxx11::string::_M_construct((ulong)&local_bc8,'\x03');
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    uVar21 = local_c88.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_bc0 + local_c88._M_string_length) {
    uVar19 = 0xf;
    if (local_bc8 != &local_bb8) {
      uVar19 = local_bb8;
    }
    if (uVar19 < local_bc0 + local_c88._M_string_length) goto LAB_001649c1;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_bc8,0,(char *)0x0,(ulong)local_c88._M_dataplus._M_p);
  }
  else {
LAB_001649c1:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c88,(ulong)local_bc8);
  }
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_c98 = *puVar16;
    lStack_c90 = puVar12[3];
    local_ca8 = &local_c98;
  }
  else {
    local_c98 = *puVar16;
    local_ca8 = (ulong *)*puVar12;
  }
  local_ca0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_ca8);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_c18 = *puVar16;
    lStack_c10 = plVar10[3];
    local_c28 = &local_c18;
  }
  else {
    local_c18 = *puVar16;
    local_c28 = (ulong *)*plVar10;
  }
  local_c20 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  puVar12 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_c28,(ulong)local_808._M_dataplus._M_p);
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_bd8 = *puVar16;
    lStack_bd0 = puVar12[3];
    local_be8 = &local_bd8;
  }
  else {
    local_bd8 = *puVar16;
    local_be8 = (ulong *)*puVar12;
  }
  local_be0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)(puVar12 + 2) = 0;
  local_b68 = &local_b58;
  std::__cxx11::string::_M_construct((ulong)&local_b68,'\x03');
  uVar19 = 0xf;
  if (local_be8 != &local_bd8) {
    uVar19 = local_bd8;
  }
  if (uVar19 < (ulong)(local_b60 + local_be0)) {
    uVar19 = 0xf;
    if (local_b68 != &local_b58) {
      uVar19 = local_b58;
    }
    if (uVar19 < (ulong)(local_b60 + local_be0)) goto LAB_00164b6a;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_b68,0,(char *)0x0,(ulong)local_be8);
  }
  else {
LAB_00164b6a:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_be8,(ulong)local_b68);
  }
  local_b88 = &local_b78;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_b78 = *puVar16;
    lStack_b70 = puVar12[3];
  }
  else {
    local_b78 = *puVar16;
    local_b88 = (ulong *)*puVar12;
  }
  local_b80 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_b88);
  psVar15 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_ba8.field_2._M_allocated_capacity = *psVar15;
    local_ba8.field_2._8_8_ = plVar10[3];
    local_ba8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_ba8.field_2._M_allocated_capacity = *psVar15;
    local_ba8._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_ba8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if (local_b88 != &local_b78) {
    operator_delete(local_b88);
  }
  if (local_b68 != &local_b58) {
    operator_delete(local_b68);
  }
  if (local_be8 != &local_bd8) {
    operator_delete(local_be8);
  }
  if (local_c28 != &local_c18) {
    operator_delete(local_c28);
  }
  if (local_ca8 != &local_c98) {
    operator_delete(local_ca8);
  }
  if (local_bc8 != &local_bb8) {
    operator_delete(local_bc8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    operator_delete(local_c88._M_dataplus._M_p);
  }
  if (local_c68 != &local_c58) {
    operator_delete(local_c68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
    operator_delete(local_c08._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
    operator_delete(local_c48._M_dataplus._M_p);
  }
  local_848 = &local_838;
  std::__cxx11::string::_M_construct((ulong)&local_848,'\x03');
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_848,0,(char *)0x0,0x2a6e99);
  local_968 = &local_958;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_958 = *puVar16;
    lStack_950 = plVar10[3];
  }
  else {
    local_958 = *puVar16;
    local_968 = (ulong *)*plVar10;
  }
  local_960 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_968);
  local_ae8 = &local_ad8;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_ad8 = *puVar16;
    lStack_ad0 = plVar10[3];
  }
  else {
    local_ad8 = *puVar16;
    local_ae8 = (ulong *)*plVar10;
  }
  local_ae0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_cc8 = &local_cb8;
  std::__cxx11::string::_M_construct((ulong)&local_cc8,'\x03');
  uVar19 = 0xf;
  if (local_ae8 != &local_ad8) {
    uVar19 = local_ad8;
  }
  if (uVar19 < (ulong)(local_cc0 + local_ae0)) {
    uVar19 = 0xf;
    if (local_cc8 != &local_cb8) {
      uVar19 = local_cb8;
    }
    if (uVar19 < (ulong)(local_cc0 + local_ae0)) goto LAB_00164e9b;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_cc8,0,(char *)0x0,(ulong)local_ae8);
  }
  else {
LAB_00164e9b:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_ae8,(ulong)local_cc8);
  }
  local_a68 = &local_a58;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_a58 = *puVar16;
    lStack_a50 = puVar12[3];
  }
  else {
    local_a58 = *puVar16;
    local_a68 = (ulong *)*puVar12;
  }
  local_a60 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_a68);
  local_ac8 = &local_ab8;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_ab8 = *puVar16;
    lStack_ab0 = plVar10[3];
  }
  else {
    local_ab8 = *puVar16;
    local_ac8 = (ulong *)*plVar10;
  }
  local_ac0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_868 = &local_858;
  std::__cxx11::string::_M_construct((ulong)&local_868,'\x03');
  uVar19 = 0xf;
  if (local_ac8 != &local_ab8) {
    uVar19 = local_ab8;
  }
  if (uVar19 < (ulong)(local_860 + local_ac0)) {
    uVar19 = 0xf;
    if (local_868 != &local_858) {
      uVar19 = local_858;
    }
    if (uVar19 < (ulong)(local_860 + local_ac0)) goto LAB_00164fee;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_868,0,(char *)0x0,(ulong)local_ac8);
  }
  else {
LAB_00164fee:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_ac8,(ulong)local_868);
  }
  local_a48 = &local_a38;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_a38 = *puVar16;
    lStack_a30 = puVar12[3];
  }
  else {
    local_a38 = *puVar16;
    local_a48 = (ulong *)*puVar12;
  }
  local_a40 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_a48);
  local_a08 = &local_9f8;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_9f8 = *puVar16;
    lStack_9f0 = plVar10[3];
  }
  else {
    local_9f8 = *puVar16;
    local_a08 = (ulong *)*plVar10;
  }
  local_a00 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_a08,multifaq::dir::PATH_TO_DATA_abi_cxx11_);
  local_948 = &local_938;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_938 = *puVar16;
    lStack_930 = plVar10[3];
  }
  else {
    local_938 = *puVar16;
    local_948 = (ulong *)*plVar10;
  }
  local_940 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_948);
  local_a28 = &local_a18;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_a18 = *puVar16;
    lStack_a10 = plVar10[3];
  }
  else {
    local_a18 = *puVar16;
    local_a28 = (ulong *)*plVar10;
  }
  local_a20 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_828 = &local_818;
  std::__cxx11::string::_M_construct((ulong)&local_828,'\x03');
  uVar19 = 0xf;
  if (local_a28 != &local_a18) {
    uVar19 = local_a18;
  }
  if (uVar19 < (ulong)(local_820 + local_a20)) {
    uVar19 = 0xf;
    if (local_828 != &local_818) {
      uVar19 = local_818;
    }
    if (uVar19 < (ulong)(local_820 + local_a20)) goto LAB_00165228;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_828,0,(char *)0x0,(ulong)local_a28);
  }
  else {
LAB_00165228:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a28,(ulong)local_828);
  }
  local_9e8 = &local_9d8;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_9d8 = *puVar16;
    lStack_9d0 = puVar12[3];
  }
  else {
    local_9d8 = *puVar16;
    local_9e8 = (ulong *)*puVar12;
  }
  local_9e0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_9e8);
  local_aa8 = &local_a98;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_a98 = *puVar16;
    lStack_a90 = plVar10[3];
  }
  else {
    local_a98 = *puVar16;
    local_aa8 = (ulong *)*plVar10;
  }
  local_aa0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_8c8 = &local_8b8;
  std::__cxx11::string::_M_construct((ulong)&local_8c8,'\x03');
  uVar19 = 0xf;
  if (local_aa8 != &local_a98) {
    uVar19 = local_a98;
  }
  if (uVar19 < (ulong)(local_8c0 + local_aa0)) {
    uVar19 = 0xf;
    if (local_8c8 != &local_8b8) {
      uVar19 = local_8b8;
    }
    if (uVar19 < (ulong)(local_8c0 + local_aa0)) goto LAB_00165381;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_8c8,0,(char *)0x0,(ulong)local_aa8);
  }
  else {
LAB_00165381:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_aa8,(ulong)local_8c8);
  }
  local_8a8 = &local_898;
  plVar10 = puVar12 + 2;
  if ((long *)*puVar12 == plVar10) {
    local_898 = *plVar10;
    lStack_890 = puVar12[3];
  }
  else {
    local_898 = *plVar10;
    local_8a8 = (long *)*puVar12;
  }
  local_8a0 = puVar12[1];
  *puVar12 = plVar10;
  puVar12[1] = 0;
  *(undefined1 *)plVar10 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_8a8);
  local_9a8 = &local_998;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_998 = *puVar16;
    lStack_990 = plVar10[3];
  }
  else {
    local_998 = *puVar16;
    local_9a8 = (ulong *)*plVar10;
  }
  local_9a0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_8e8 = &local_8d8;
  std::__cxx11::string::_M_construct((ulong)&local_8e8,'\x06');
  uVar19 = 0xf;
  if (local_9a8 != &local_998) {
    uVar19 = local_998;
  }
  if (uVar19 < (ulong)(local_8e0 + local_9a0)) {
    uVar19 = 0xf;
    if (local_8e8 != &local_8d8) {
      uVar19 = local_8d8;
    }
    if (uVar19 < (ulong)(local_8e0 + local_9a0)) goto LAB_001654ea;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_8e8,0,(char *)0x0,(ulong)local_9a8);
  }
  else {
LAB_001654ea:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9a8,(ulong)local_8e8);
  }
  local_a88 = &local_a78;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_a78 = *puVar16;
    lStack_a70 = puVar12[3];
  }
  else {
    local_a78 = *puVar16;
    local_a88 = (ulong *)*puVar12;
  }
  local_a80 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_a88);
  local_b28 = &local_b18;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_b18 = *puVar16;
    lStack_b10 = plVar10[3];
  }
  else {
    local_b18 = *puVar16;
    local_b28 = (ulong *)*plVar10;
  }
  local_b20 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_9c8 = &local_9b8;
  std::__cxx11::string::_M_construct((ulong)&local_9c8,'\x06');
  uVar19 = 0xf;
  if (local_b28 != &local_b18) {
    uVar19 = local_b18;
  }
  if (uVar19 < (ulong)(local_9c0 + local_b20)) {
    uVar19 = 0xf;
    if (local_9c8 != &local_9b8) {
      uVar19 = local_9b8;
    }
    if (uVar19 < (ulong)(local_9c0 + local_b20)) goto LAB_00165653;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_9c8,0,(char *)0x0,(ulong)local_b28);
  }
  else {
LAB_00165653:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b28,(ulong)local_9c8);
  }
  local_b68 = &local_b58;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_b58 = *puVar16;
    lStack_b50 = puVar12[3];
  }
  else {
    local_b58 = *puVar16;
    local_b68 = (ulong *)*puVar12;
  }
  local_b60 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_b68);
  local_bc8 = &local_bb8;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_bb8 = *puVar16;
    lStack_bb0 = plVar10[3];
  }
  else {
    local_bb8 = *puVar16;
    local_bc8 = (ulong *)*plVar10;
  }
  local_bc0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_908 = &local_8f8;
  std::__cxx11::string::_M_construct((ulong)&local_908,'\x03');
  uVar19 = 0xf;
  if (local_bc8 != &local_bb8) {
    uVar19 = local_bb8;
  }
  if (uVar19 < (ulong)(local_900 + local_bc0)) {
    uVar19 = 0xf;
    if (local_908 != &local_8f8) {
      uVar19 = local_8f8;
    }
    if (uVar19 < (ulong)(local_900 + local_bc0)) goto LAB_001657bc;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_908,0,(char *)0x0,(ulong)local_bc8);
  }
  else {
LAB_001657bc:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_bc8,(ulong)local_908);
  }
  local_c08._M_dataplus._M_p = (pointer)&local_c08.field_2;
  psVar15 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_c08.field_2._M_allocated_capacity = *psVar15;
    local_c08.field_2._8_8_ = puVar12[3];
  }
  else {
    local_c08.field_2._M_allocated_capacity = *psVar15;
    local_c08._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_c08._M_string_length = puVar12[1];
  *puVar12 = psVar15;
  puVar12[1] = 0;
  *(undefined1 *)psVar15 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_c08);
  local_c48._M_dataplus._M_p = (pointer)&local_c48.field_2;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar16) {
    local_c48.field_2._M_allocated_capacity = *puVar16;
    local_c48.field_2._8_8_ = plVar10[3];
  }
  else {
    local_c48.field_2._M_allocated_capacity = *puVar16;
    local_c48._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_c48._M_string_length = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_988 = &local_978;
  std::__cxx11::string::_M_construct((ulong)&local_988,'\x03');
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
    uVar21 = local_c48.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_980 + local_c48._M_string_length) {
    uVar19 = 0xf;
    if (local_988 != &local_978) {
      uVar19 = local_978;
    }
    if (uVar19 < local_980 + local_c48._M_string_length) goto LAB_00165925;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_988,0,(char *)0x0,(ulong)local_c48._M_dataplus._M_p);
  }
  else {
LAB_00165925:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c48,(ulong)local_988);
  }
  local_c68 = &local_c58;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_c58 = *puVar16;
    lStack_c50 = puVar12[3];
  }
  else {
    local_c58 = *puVar16;
    local_c68 = (ulong *)*puVar12;
  }
  local_c60 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_c68);
  local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar16) {
    local_c88.field_2._M_allocated_capacity = *puVar16;
    local_c88.field_2._8_8_ = plVar10[3];
  }
  else {
    local_c88.field_2._M_allocated_capacity = *puVar16;
    local_c88._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_c88._M_string_length = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_888 = &local_878;
  std::__cxx11::string::_M_construct((ulong)&local_888,'\x06');
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    uVar21 = local_c88.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_880 + local_c88._M_string_length) {
    uVar19 = 0xf;
    if (local_888 != &local_878) {
      uVar19 = local_878;
    }
    if (uVar19 < local_880 + local_c88._M_string_length) goto LAB_00165a67;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_888,0,(char *)0x0,(ulong)local_c88._M_dataplus._M_p);
  }
  else {
LAB_00165a67:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c88,(ulong)local_888);
  }
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_c98 = *puVar16;
    lStack_c90 = puVar12[3];
    local_ca8 = &local_c98;
  }
  else {
    local_c98 = *puVar16;
    local_ca8 = (ulong *)*puVar12;
  }
  local_ca0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_ca8);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_c18 = *puVar16;
    lStack_c10 = plVar10[3];
    local_c28 = &local_c18;
  }
  else {
    local_c18 = *puVar16;
    local_c28 = (ulong *)*plVar10;
  }
  local_c20 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_928 = &local_918;
  std::__cxx11::string::_M_construct((ulong)&local_928,'\x03');
  uVar19 = 0xf;
  if (local_c28 != &local_c18) {
    uVar19 = local_c18;
  }
  if (uVar19 < (ulong)(local_920 + local_c20)) {
    uVar19 = 0xf;
    if (local_928 != &local_918) {
      uVar19 = local_918;
    }
    if (uVar19 < (ulong)(local_920 + local_c20)) goto LAB_00165ba9;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_928,0,(char *)0x0,(ulong)local_c28);
  }
  else {
LAB_00165ba9:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c28,(ulong)local_928);
  }
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_bd8 = *puVar16;
    lStack_bd0 = puVar12[3];
    local_be8 = &local_bd8;
  }
  else {
    local_bd8 = *puVar16;
    local_be8 = (ulong *)*puVar12;
  }
  local_be0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_be8);
  local_b88 = &local_b78;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_b78 = *puVar16;
    lStack_b70 = plVar10[3];
  }
  else {
    local_b78 = *puVar16;
    local_b88 = (ulong *)*plVar10;
  }
  local_b80 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if (local_be8 != &local_bd8) {
    operator_delete(local_be8);
  }
  if (local_928 != &local_918) {
    operator_delete(local_928);
  }
  if (local_c28 != &local_c18) {
    operator_delete(local_c28);
  }
  if (local_ca8 != &local_c98) {
    operator_delete(local_ca8);
  }
  if (local_888 != &local_878) {
    operator_delete(local_888);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    operator_delete(local_c88._M_dataplus._M_p);
  }
  if (local_c68 != &local_c58) {
    operator_delete(local_c68);
  }
  if (local_988 != &local_978) {
    operator_delete(local_988);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
    operator_delete(local_c48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
    operator_delete(local_c08._M_dataplus._M_p);
  }
  if (local_908 != &local_8f8) {
    operator_delete(local_908);
  }
  if (local_bc8 != &local_bb8) {
    operator_delete(local_bc8);
  }
  if (local_b68 != &local_b58) {
    operator_delete(local_b68);
  }
  if (local_9c8 != &local_9b8) {
    operator_delete(local_9c8);
  }
  if (local_b28 != &local_b18) {
    operator_delete(local_b28);
  }
  if (local_a88 != &local_a78) {
    operator_delete(local_a88);
  }
  if (local_8e8 != &local_8d8) {
    operator_delete(local_8e8);
  }
  if (local_9a8 != &local_998) {
    operator_delete(local_9a8);
  }
  if (local_8a8 != &local_898) {
    operator_delete(local_8a8);
  }
  if (local_8c8 != &local_8b8) {
    operator_delete(local_8c8);
  }
  if (local_aa8 != &local_a98) {
    operator_delete(local_aa8);
  }
  if (local_9e8 != &local_9d8) {
    operator_delete(local_9e8);
  }
  if (local_828 != &local_818) {
    operator_delete(local_828);
  }
  if (local_a28 != &local_a18) {
    operator_delete(local_a28);
  }
  if (local_948 != &local_938) {
    operator_delete(local_948);
  }
  if (local_a08 != &local_9f8) {
    operator_delete(local_a08);
  }
  if (local_a48 != &local_a38) {
    operator_delete(local_a48);
  }
  if (local_868 != &local_858) {
    operator_delete(local_868);
  }
  if (local_ac8 != &local_ab8) {
    operator_delete(local_ac8);
  }
  if (local_a68 != &local_a58) {
    operator_delete(local_a68);
  }
  if (local_cc8 != &local_cb8) {
    operator_delete(local_cc8);
  }
  if (local_ae8 != &local_ad8) {
    operator_delete(local_ae8);
  }
  if (local_968 != &local_958) {
    operator_delete(local_968);
  }
  if (local_848 != &local_838) {
    operator_delete(local_848);
  }
  local_be8 = &local_bd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_be8,"");
  uVar19 = 0;
  while( true ) {
    sVar8 = TreeDecomposition::numberOfAttributes
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar8 <= uVar19) break;
    pAVar9 = TreeDecomposition::getAttribute
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar19);
    local_b68 = &local_b58;
    std::__cxx11::string::_M_construct((ulong)&local_b68,'\t');
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_b68);
    local_bc8 = &local_bb8;
    puVar16 = puVar12 + 2;
    if ((ulong *)*puVar12 == puVar16) {
      local_bb8 = *puVar16;
      lStack_bb0 = puVar12[3];
    }
    else {
      local_bb8 = *puVar16;
      local_bc8 = (ulong *)*puVar12;
    }
    local_bc0 = puVar12[1];
    *puVar12 = puVar16;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    cVar20 = '\x01';
    if (9 < uVar19) {
      uVar18 = uVar19;
      cVar7 = '\x04';
      do {
        cVar20 = cVar7;
        if (uVar18 < 100) {
          cVar20 = cVar20 + -2;
          goto LAB_0016619f;
        }
        if (uVar18 < 1000) {
          cVar20 = cVar20 + -1;
          goto LAB_0016619f;
        }
        if (uVar18 < 10000) goto LAB_0016619f;
        bVar5 = 99999 < uVar18;
        uVar18 = uVar18 / 10000;
        cVar7 = cVar20 + '\x04';
      } while (bVar5);
      cVar20 = cVar20 + '\x01';
    }
LAB_0016619f:
    local_b28 = &local_b18;
    std::__cxx11::string::_M_construct((ulong)&local_b28,cVar20);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b28,(uint)local_b20,uVar19);
    uVar18 = 0xf;
    if (local_bc8 != &local_bb8) {
      uVar18 = local_bb8;
    }
    if (uVar18 < (ulong)(local_b20 + local_bc0)) {
      uVar18 = 0xf;
      if (local_b28 != &local_b18) {
        uVar18 = local_b18;
      }
      if (uVar18 < (ulong)(local_b20 + local_bc0)) goto LAB_00166231;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_b28,0,(char *)0x0,(ulong)local_bc8);
    }
    else {
LAB_00166231:
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_bc8,(ulong)local_b28);
    }
    local_c08._M_dataplus._M_p = (pointer)&local_c08.field_2;
    psVar15 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_c08.field_2._M_allocated_capacity = *psVar15;
      local_c08.field_2._8_8_ = puVar12[3];
    }
    else {
      local_c08.field_2._M_allocated_capacity = *psVar15;
      local_c08._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_c08._M_string_length = puVar12[1];
    *puVar12 = psVar15;
    puVar12[1] = 0;
    *(undefined1 *)psVar15 = 0;
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_c08);
    local_c48._M_dataplus._M_p = (pointer)&local_c48.field_2;
    puVar16 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_c48.field_2._M_allocated_capacity = *puVar16;
      local_c48.field_2._8_8_ = puVar12[3];
    }
    else {
      local_c48.field_2._M_allocated_capacity = *puVar16;
      local_c48._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_c48._M_string_length = puVar12[1];
    *puVar12 = puVar16;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_c48);
    local_c68 = &local_c58;
    puVar16 = puVar12 + 2;
    if ((ulong *)*puVar12 == puVar16) {
      local_c58 = *puVar16;
      lStack_c50 = puVar12[3];
    }
    else {
      local_c58 = *puVar16;
      local_c68 = (ulong *)*puVar12;
    }
    local_c60 = puVar12[1];
    *puVar12 = puVar16;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    puVar12 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_c68,(ulong)(pAVar9->_name)._M_dataplus._M_p);
    local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
    puVar16 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_c88.field_2._M_allocated_capacity = *puVar16;
      local_c88.field_2._8_8_ = puVar12[3];
    }
    else {
      local_c88.field_2._M_allocated_capacity = *puVar16;
      local_c88._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_c88._M_string_length = puVar12[1];
    *puVar12 = puVar16;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    puVar12 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_c88,
                         (ulong)local_748[(ulong)(((this->_categoricalFeatures).
                                                   super__Base_bitset<2UL>._M_w[uVar19 >> 6] >>
                                                   (uVar19 & 0x3f) & 1) != 0) * 4]);
    local_ca8 = &local_c98;
    puVar16 = puVar12 + 2;
    if ((ulong *)*puVar12 == puVar16) {
      local_c98 = *puVar16;
      lStack_c90 = puVar12[3];
    }
    else {
      local_c98 = *puVar16;
      local_ca8 = (ulong *)*puVar12;
    }
    local_ca0 = puVar12[1];
    *puVar12 = puVar16;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_ca8);
    local_c28 = &local_c18;
    puVar16 = puVar12 + 2;
    if ((ulong *)*puVar12 == puVar16) {
      local_c18 = *puVar16;
      lStack_c10 = puVar12[3];
    }
    else {
      local_c18 = *puVar16;
      local_c28 = (ulong *)*puVar12;
    }
    local_c20 = puVar12[1];
    *puVar12 = puVar16;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_be8,(ulong)local_c28);
    if (local_c28 != &local_c18) {
      operator_delete(local_c28);
    }
    if (local_ca8 != &local_c98) {
      operator_delete(local_ca8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
      operator_delete(local_c88._M_dataplus._M_p);
    }
    if (local_c68 != &local_c58) {
      operator_delete(local_c68);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
      operator_delete(local_c48._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
      operator_delete(local_c08._M_dataplus._M_p);
    }
    if (local_b28 != &local_b18) {
      operator_delete(local_b28);
    }
    if (local_bc8 != &local_bb8) {
      operator_delete(local_bc8);
    }
    if (local_b68 != &local_b58) {
      operator_delete(local_b68);
    }
    uVar19 = uVar19 + 1;
  }
  local_cc8 = &local_cb8;
  std::__cxx11::string::_M_construct((ulong)&local_cc8,'\x03');
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_cc8,0,(char *)0x0,0x2a6f37);
  local_848 = &local_838;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_838 = *puVar16;
    lStack_830 = plVar10[3];
  }
  else {
    local_838 = *puVar16;
    local_848 = (ulong *)*plVar10;
  }
  local_840 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_848);
  local_968 = &local_958;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_958 = *puVar16;
    lStack_950 = plVar10[3];
  }
  else {
    local_958 = *puVar16;
    local_968 = (ulong *)*plVar10;
  }
  local_960 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_868 = &local_858;
  std::__cxx11::string::_M_construct((ulong)&local_868,'\x06');
  uVar19 = 0xf;
  if (local_968 != &local_958) {
    uVar19 = local_958;
  }
  if (uVar19 < (ulong)(local_860 + local_960)) {
    uVar19 = 0xf;
    if (local_868 != &local_858) {
      uVar19 = local_858;
    }
    if (uVar19 < (ulong)(local_860 + local_960)) goto LAB_00166747;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_868,0,(char *)0x0,(ulong)local_968);
  }
  else {
LAB_00166747:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_968,(ulong)local_868);
  }
  local_ae8 = &local_ad8;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_ad8 = *puVar16;
    lStack_ad0 = puVar12[3];
  }
  else {
    local_ad8 = *puVar16;
    local_ae8 = (ulong *)*puVar12;
  }
  local_ae0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_ae8);
  local_a68 = &local_a58;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_a58 = *puVar16;
    lStack_a50 = plVar10[3];
  }
  else {
    local_a58 = *puVar16;
    local_a68 = (ulong *)*plVar10;
  }
  local_a60 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_828 = &local_818;
  std::__cxx11::string::_M_construct((ulong)&local_828,'\x03');
  uVar19 = 0xf;
  if (local_a68 != &local_a58) {
    uVar19 = local_a58;
  }
  if (uVar19 < (ulong)(local_820 + local_a60)) {
    uVar19 = 0xf;
    if (local_828 != &local_818) {
      uVar19 = local_818;
    }
    if (uVar19 < (ulong)(local_820 + local_a60)) goto LAB_001668b0;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_828,0,(char *)0x0,(ulong)local_a68);
  }
  else {
LAB_001668b0:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a68,(ulong)local_828);
  }
  local_ac8 = &local_ab8;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_ab8 = *puVar16;
    lStack_ab0 = puVar12[3];
  }
  else {
    local_ab8 = *puVar16;
    local_ac8 = (ulong *)*puVar12;
  }
  local_ac0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_ac8);
  local_a48 = &local_a38;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_a38 = *puVar16;
    lStack_a30 = plVar10[3];
  }
  else {
    local_a38 = *puVar16;
    local_a48 = (ulong *)*plVar10;
  }
  local_a40 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_8c8 = &local_8b8;
  std::__cxx11::string::_M_construct((ulong)&local_8c8,'\x03');
  uVar19 = 0xf;
  if (local_a48 != &local_a38) {
    uVar19 = local_a38;
  }
  if (uVar19 < (ulong)(local_8c0 + local_a40)) {
    uVar19 = 0xf;
    if (local_8c8 != &local_8b8) {
      uVar19 = local_8b8;
    }
    if (uVar19 < (ulong)(local_8c0 + local_a40)) goto LAB_00166a19;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_8c8,0,(char *)0x0,(ulong)local_a48);
  }
  else {
LAB_00166a19:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a48,(ulong)local_8c8);
  }
  local_a08 = &local_9f8;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_9f8 = *puVar16;
    lStack_9f0 = puVar12[3];
  }
  else {
    local_9f8 = *puVar16;
    local_a08 = (ulong *)*puVar12;
  }
  local_a00 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_a08);
  local_948 = &local_938;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_938 = *puVar16;
    lStack_930 = plVar10[3];
  }
  else {
    local_938 = *puVar16;
    local_948 = (ulong *)*plVar10;
  }
  local_940 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_8e8 = &local_8d8;
  std::__cxx11::string::_M_construct((ulong)&local_8e8,'\x03');
  uVar19 = 0xf;
  if (local_948 != &local_938) {
    uVar19 = local_938;
  }
  if (uVar19 < (ulong)(local_8e0 + local_940)) {
    uVar19 = 0xf;
    if (local_8e8 != &local_8d8) {
      uVar19 = local_8d8;
    }
    if (uVar19 < (ulong)(local_8e0 + local_940)) goto LAB_00166b82;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_8e8,0,(char *)0x0,(ulong)local_948);
  }
  else {
LAB_00166b82:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_948,(ulong)local_8e8);
  }
  local_a28 = &local_a18;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_a18 = *puVar16;
    lStack_a10 = puVar12[3];
  }
  else {
    local_a18 = *puVar16;
    local_a28 = (ulong *)*puVar12;
  }
  local_a20 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_a28);
  local_9e8 = &local_9d8;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_9d8 = *puVar16;
    lStack_9d0 = plVar10[3];
  }
  else {
    local_9d8 = *puVar16;
    local_9e8 = (ulong *)*plVar10;
  }
  local_9e0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_9c8 = &local_9b8;
  std::__cxx11::string::_M_construct((ulong)&local_9c8,'\x03');
  uVar19 = 0xf;
  if (local_9e8 != &local_9d8) {
    uVar19 = local_9d8;
  }
  if (uVar19 < (ulong)(local_9c0 + local_9e0)) {
    uVar19 = 0xf;
    if (local_9c8 != &local_9b8) {
      uVar19 = local_9b8;
    }
    if (uVar19 < (ulong)(local_9c0 + local_9e0)) goto LAB_00166ceb;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_9c8,0,(char *)0x0,(ulong)local_9e8);
  }
  else {
LAB_00166ceb:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9e8,(ulong)local_9c8);
  }
  local_aa8 = &local_a98;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_a98 = *puVar16;
    lStack_a90 = puVar12[3];
  }
  else {
    local_a98 = *puVar16;
    local_aa8 = (ulong *)*puVar12;
  }
  local_aa0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_aa8);
  local_8a8 = &local_898;
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_898 = *plVar13;
    lStack_890 = plVar10[3];
  }
  else {
    local_898 = *plVar13;
    local_8a8 = (long *)*plVar10;
  }
  local_8a0 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_8a8,(ulong)local_be8);
  local_9a8 = &local_998;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_998 = *puVar16;
    lStack_990 = plVar10[3];
  }
  else {
    local_998 = *puVar16;
    local_9a8 = (ulong *)*plVar10;
  }
  local_9a0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_908 = &local_8f8;
  std::__cxx11::string::_M_construct((ulong)&local_908,'\x03');
  uVar19 = 0xf;
  if (local_9a8 != &local_998) {
    uVar19 = local_998;
  }
  if (uVar19 < (ulong)(local_900 + local_9a0)) {
    uVar19 = 0xf;
    if (local_908 != &local_8f8) {
      uVar19 = local_8f8;
    }
    if (uVar19 < (ulong)(local_900 + local_9a0)) goto LAB_00166ec2;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_908,0,(char *)0x0,(ulong)local_9a8);
  }
  else {
LAB_00166ec2:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9a8,(ulong)local_908);
  }
  local_a88 = &local_a78;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_a78 = *puVar16;
    lStack_a70 = puVar12[3];
  }
  else {
    local_a78 = *puVar16;
    local_a88 = (ulong *)*puVar12;
  }
  local_a80 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_a88);
  local_b28 = &local_b18;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_b18 = *puVar16;
    lStack_b10 = plVar10[3];
  }
  else {
    local_b18 = *puVar16;
    local_b28 = (ulong *)*plVar10;
  }
  local_b20 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_988 = &local_978;
  std::__cxx11::string::_M_construct((ulong)&local_988,'\x03');
  uVar19 = 0xf;
  if (local_b28 != &local_b18) {
    uVar19 = local_b18;
  }
  if (uVar19 < (ulong)(local_980 + local_b20)) {
    uVar19 = 0xf;
    if (local_988 != &local_978) {
      uVar19 = local_978;
    }
    if (uVar19 < (ulong)(local_980 + local_b20)) goto LAB_0016702b;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_988,0,(char *)0x0,(ulong)local_b28);
  }
  else {
LAB_0016702b:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b28,(ulong)local_988);
  }
  local_b68 = &local_b58;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_b58 = *puVar16;
    lStack_b50 = puVar12[3];
  }
  else {
    local_b58 = *puVar16;
    local_b68 = (ulong *)*puVar12;
  }
  local_b60 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_b68);
  local_bc8 = &local_bb8;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_bb8 = *puVar16;
    lStack_bb0 = plVar10[3];
  }
  else {
    local_bb8 = *puVar16;
    local_bc8 = (ulong *)*plVar10;
  }
  local_bc0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_888 = &local_878;
  std::__cxx11::string::_M_construct((ulong)&local_888,'\x06');
  uVar19 = 0xf;
  if (local_bc8 != &local_bb8) {
    uVar19 = local_bb8;
  }
  if (uVar19 < (ulong)(local_880 + local_bc0)) {
    uVar19 = 0xf;
    if (local_888 != &local_878) {
      uVar19 = local_878;
    }
    if (uVar19 < (ulong)(local_880 + local_bc0)) goto LAB_00167194;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_888,0,(char *)0x0,(ulong)local_bc8);
  }
  else {
LAB_00167194:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_bc8,(ulong)local_888);
  }
  local_c08._M_dataplus._M_p = (pointer)&local_c08.field_2;
  psVar15 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_c08.field_2._M_allocated_capacity = *psVar15;
    local_c08.field_2._8_8_ = puVar12[3];
  }
  else {
    local_c08.field_2._M_allocated_capacity = *psVar15;
    local_c08._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_c08._M_string_length = puVar12[1];
  *puVar12 = psVar15;
  puVar12[1] = 0;
  *(undefined1 *)psVar15 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_c08);
  local_c48._M_dataplus._M_p = (pointer)&local_c48.field_2;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar16) {
    local_c48.field_2._M_allocated_capacity = *puVar16;
    local_c48.field_2._8_8_ = plVar10[3];
  }
  else {
    local_c48.field_2._M_allocated_capacity = *puVar16;
    local_c48._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_c48._M_string_length = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_928 = &local_918;
  std::__cxx11::string::_M_construct((ulong)&local_928,'\x03');
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
    uVar21 = local_c48.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_920 + local_c48._M_string_length) {
    uVar19 = 0xf;
    if (local_928 != &local_918) {
      uVar19 = local_918;
    }
    if (uVar19 < local_920 + local_c48._M_string_length) goto LAB_001672fd;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_928,0,(char *)0x0,(ulong)local_c48._M_dataplus._M_p);
  }
  else {
LAB_001672fd:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c48,(ulong)local_928);
  }
  local_c68 = &local_c58;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_c58 = *puVar16;
    lStack_c50 = puVar12[3];
  }
  else {
    local_c58 = *puVar16;
    local_c68 = (ulong *)*puVar12;
  }
  local_c60 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_c68);
  local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar16) {
    local_c88.field_2._M_allocated_capacity = *puVar16;
    local_c88.field_2._8_8_ = plVar10[3];
  }
  else {
    local_c88.field_2._M_allocated_capacity = *puVar16;
    local_c88._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_c88._M_string_length = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_7e8 = &local_7d8;
  std::__cxx11::string::_M_construct((ulong)&local_7e8,'\x06');
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    uVar21 = local_c88.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_7e0 + local_c88._M_string_length) {
    uVar19 = 0xf;
    if (local_7e8 != &local_7d8) {
      uVar19 = local_7d8;
    }
    if (uVar19 < local_7e0 + local_c88._M_string_length) goto LAB_0016743f;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_7e8,0,(char *)0x0,(ulong)local_c88._M_dataplus._M_p);
  }
  else {
LAB_0016743f:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c88,(ulong)local_7e8);
  }
  local_ca8 = &local_c98;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_c98 = *puVar16;
    lStack_c90 = puVar12[3];
  }
  else {
    local_c98 = *puVar16;
    local_ca8 = (ulong *)*puVar12;
  }
  local_ca0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_ca8);
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_c18 = *puVar16;
    lStack_c10 = plVar10[3];
    local_c28 = &local_c18;
  }
  else {
    local_c18 = *puVar16;
    local_c28 = (ulong *)*plVar10;
  }
  local_c20 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if (local_ca8 != &local_c98) {
    operator_delete(local_ca8);
  }
  if (local_7e8 != &local_7d8) {
    operator_delete(local_7e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    operator_delete(local_c88._M_dataplus._M_p);
  }
  if (local_c68 != &local_c58) {
    operator_delete(local_c68);
  }
  if (local_928 != &local_918) {
    operator_delete(local_928);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
    operator_delete(local_c48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
    operator_delete(local_c08._M_dataplus._M_p);
  }
  if (local_888 != &local_878) {
    operator_delete(local_888);
  }
  if (local_bc8 != &local_bb8) {
    operator_delete(local_bc8);
  }
  if (local_b68 != &local_b58) {
    operator_delete(local_b68);
  }
  if (local_988 != &local_978) {
    operator_delete(local_988);
  }
  if (local_b28 != &local_b18) {
    operator_delete(local_b28);
  }
  if (local_a88 != &local_a78) {
    operator_delete(local_a88);
  }
  if (local_908 != &local_8f8) {
    operator_delete(local_908);
  }
  if (local_9a8 != &local_998) {
    operator_delete(local_9a8);
  }
  if (local_8a8 != &local_898) {
    operator_delete(local_8a8);
  }
  if (local_aa8 != &local_a98) {
    operator_delete(local_aa8);
  }
  if (local_9c8 != &local_9b8) {
    operator_delete(local_9c8);
  }
  if (local_9e8 != &local_9d8) {
    operator_delete(local_9e8);
  }
  if (local_a28 != &local_a18) {
    operator_delete(local_a28);
  }
  if (local_8e8 != &local_8d8) {
    operator_delete(local_8e8);
  }
  if (local_948 != &local_938) {
    operator_delete(local_948);
  }
  if (local_a08 != &local_9f8) {
    operator_delete(local_a08);
  }
  if (local_8c8 != &local_8b8) {
    operator_delete(local_8c8);
  }
  if (local_a48 != &local_a38) {
    operator_delete(local_a48);
  }
  if (local_ac8 != &local_ab8) {
    operator_delete(local_ac8);
  }
  if (local_828 != &local_818) {
    operator_delete(local_828);
  }
  if (local_a68 != &local_a58) {
    operator_delete(local_a68);
  }
  if (local_ae8 != &local_ad8) {
    operator_delete(local_ae8);
  }
  if (local_868 != &local_858) {
    operator_delete(local_868);
  }
  if (local_968 != &local_958) {
    operator_delete(local_968);
  }
  if (local_848 != &local_838) {
    operator_delete(local_848);
  }
  if (local_cc8 != &local_cb8) {
    operator_delete(local_cc8);
  }
  local_828 = &local_818;
  std::__cxx11::string::_M_construct((ulong)&local_828,'\x03');
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_828,0,(char *)0x0,0x2a706b);
  local_868 = &local_858;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_858 = *puVar16;
    lStack_850 = plVar10[3];
  }
  else {
    local_858 = *puVar16;
    local_868 = (ulong *)*plVar10;
  }
  local_860 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_868);
  local_cc8 = &local_cb8;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_cb8 = *puVar16;
    lStack_cb0 = plVar10[3];
  }
  else {
    local_cb8 = *puVar16;
    local_cc8 = (ulong *)*plVar10;
  }
  local_cc0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_8c8 = &local_8b8;
  std::__cxx11::string::_M_construct((ulong)&local_8c8,'\x03');
  uVar19 = 0xf;
  if (local_cc8 != &local_cb8) {
    uVar19 = local_cb8;
  }
  if (uVar19 < (ulong)(local_8c0 + local_cc0)) {
    uVar19 = 0xf;
    if (local_8c8 != &local_8b8) {
      uVar19 = local_8b8;
    }
    if (uVar19 < (ulong)(local_8c0 + local_cc0)) goto LAB_00167a50;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_8c8,0,(char *)0x0,(ulong)local_cc8);
  }
  else {
LAB_00167a50:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_cc8,(ulong)local_8c8);
  }
  local_848 = &local_838;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_838 = *puVar16;
    lStack_830 = puVar12[3];
  }
  else {
    local_838 = *puVar16;
    local_848 = (ulong *)*puVar12;
  }
  local_840 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_848);
  local_968 = &local_958;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_958 = *puVar16;
    lStack_950 = plVar10[3];
  }
  else {
    local_958 = *puVar16;
    local_968 = (ulong *)*plVar10;
  }
  local_960 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_8e8 = &local_8d8;
  std::__cxx11::string::_M_construct((ulong)&local_8e8,'\x03');
  uVar19 = 0xf;
  if (local_968 != &local_958) {
    uVar19 = local_958;
  }
  if (uVar19 < (ulong)(local_8e0 + local_960)) {
    uVar19 = 0xf;
    if (local_8e8 != &local_8d8) {
      uVar19 = local_8d8;
    }
    if (uVar19 < (ulong)(local_8e0 + local_960)) goto LAB_00167bb6;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_8e8,0,(char *)0x0,(ulong)local_968);
  }
  else {
LAB_00167bb6:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_968,(ulong)local_8e8);
  }
  local_ae8 = &local_ad8;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_ad8 = *puVar16;
    lStack_ad0 = puVar12[3];
  }
  else {
    local_ad8 = *puVar16;
    local_ae8 = (ulong *)*puVar12;
  }
  local_ae0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_ae8);
  local_a68 = &local_a58;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_a58 = *puVar16;
    lStack_a50 = plVar10[3];
  }
  else {
    local_a58 = *puVar16;
    local_a68 = (ulong *)*plVar10;
  }
  local_a60 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_9c8 = &local_9b8;
  std::__cxx11::string::_M_construct((ulong)&local_9c8,'\x03');
  uVar19 = 0xf;
  if (local_a68 != &local_a58) {
    uVar19 = local_a58;
  }
  if (uVar19 < (ulong)(local_9c0 + local_a60)) {
    uVar19 = 0xf;
    if (local_9c8 != &local_9b8) {
      uVar19 = local_9b8;
    }
    if (uVar19 < (ulong)(local_9c0 + local_a60)) goto LAB_00167d1f;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_9c8,0,(char *)0x0,(ulong)local_a68);
  }
  else {
LAB_00167d1f:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a68,(ulong)local_9c8);
  }
  local_ac8 = &local_ab8;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_ab8 = *puVar16;
    lStack_ab0 = puVar12[3];
  }
  else {
    local_ab8 = *puVar16;
    local_ac8 = (ulong *)*puVar12;
  }
  local_ac0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_ac8);
  local_a48 = &local_a38;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_a38 = *puVar16;
    lStack_a30 = plVar10[3];
  }
  else {
    local_a38 = *puVar16;
    local_a48 = (ulong *)*plVar10;
  }
  local_a40 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_908 = &local_8f8;
  std::__cxx11::string::_M_construct((ulong)&local_908,'\x06');
  uVar19 = 0xf;
  if (local_a48 != &local_a38) {
    uVar19 = local_a38;
  }
  if (uVar19 < (ulong)(local_900 + local_a40)) {
    uVar19 = 0xf;
    if (local_908 != &local_8f8) {
      uVar19 = local_8f8;
    }
    if (uVar19 < (ulong)(local_900 + local_a40)) goto LAB_00167e88;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_908,0,(char *)0x0,(ulong)local_a48);
  }
  else {
LAB_00167e88:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a48,(ulong)local_908);
  }
  local_a08 = &local_9f8;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_9f8 = *puVar16;
    lStack_9f0 = puVar12[3];
  }
  else {
    local_9f8 = *puVar16;
    local_a08 = (ulong *)*puVar12;
  }
  local_a00 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_a08);
  local_948 = &local_938;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_938 = *puVar16;
    lStack_930 = plVar10[3];
  }
  else {
    local_938 = *puVar16;
    local_948 = (ulong *)*plVar10;
  }
  local_940 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_988 = &local_978;
  std::__cxx11::string::_M_construct((ulong)&local_988,'\x06');
  uVar19 = 0xf;
  if (local_948 != &local_938) {
    uVar19 = local_938;
  }
  if (uVar19 < (ulong)(local_980 + local_940)) {
    uVar19 = 0xf;
    if (local_988 != &local_978) {
      uVar19 = local_978;
    }
    if (uVar19 < (ulong)(local_980 + local_940)) goto LAB_00167ff1;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_988,0,(char *)0x0,(ulong)local_948);
  }
  else {
LAB_00167ff1:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_948,(ulong)local_988);
  }
  local_a28 = &local_a18;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_a18 = *puVar16;
    lStack_a10 = puVar12[3];
  }
  else {
    local_a18 = *puVar16;
    local_a28 = (ulong *)*puVar12;
  }
  local_a20 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_a28);
  local_9e8 = &local_9d8;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_9d8 = *puVar16;
    lStack_9d0 = plVar10[3];
  }
  else {
    local_9d8 = *puVar16;
    local_9e8 = (ulong *)*plVar10;
  }
  local_9e0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_888 = &local_878;
  std::__cxx11::string::_M_construct((ulong)&local_888,'\x06');
  uVar19 = 0xf;
  if (local_9e8 != &local_9d8) {
    uVar19 = local_9d8;
  }
  if (uVar19 < (ulong)(local_880 + local_9e0)) {
    uVar19 = 0xf;
    if (local_888 != &local_878) {
      uVar19 = local_878;
    }
    if (uVar19 < (ulong)(local_880 + local_9e0)) goto LAB_0016815a;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_888,0,(char *)0x0,(ulong)local_9e8);
  }
  else {
LAB_0016815a:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9e8,(ulong)local_888);
  }
  local_aa8 = &local_a98;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_a98 = *puVar16;
    lStack_a90 = puVar12[3];
  }
  else {
    local_a98 = *puVar16;
    local_aa8 = (ulong *)*puVar12;
  }
  local_aa0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_aa8);
  local_8a8 = &local_898;
  plVar13 = plVar10 + 2;
  if ((long *)*plVar10 == plVar13) {
    local_898 = *plVar13;
    lStack_890 = plVar10[3];
  }
  else {
    local_898 = *plVar13;
    local_8a8 = (long *)*plVar10;
  }
  local_8a0 = plVar10[1];
  *plVar10 = (long)plVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  pAVar9 = TreeDecomposition::getAttribute
                     ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(long)this->_labelID);
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_8a8,(ulong)(pAVar9->_name)._M_dataplus._M_p);
  local_9a8 = &local_998;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_998 = *puVar16;
    lStack_990 = plVar10[3];
  }
  else {
    local_998 = *puVar16;
    local_9a8 = (ulong *)*plVar10;
  }
  local_9a0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_9a8);
  local_a88 = &local_a78;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_a78 = *puVar16;
    lStack_a70 = plVar10[3];
  }
  else {
    local_a78 = *puVar16;
    local_a88 = (ulong *)*plVar10;
  }
  local_a80 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_928 = &local_918;
  std::__cxx11::string::_M_construct((ulong)&local_928,'\x06');
  uVar19 = 0xf;
  if (local_a88 != &local_a78) {
    uVar19 = local_a78;
  }
  if (uVar19 < (ulong)(local_920 + local_a80)) {
    uVar19 = 0xf;
    if (local_928 != &local_918) {
      uVar19 = local_918;
    }
    if (uVar19 < (ulong)(local_920 + local_a80)) goto LAB_001683aa;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_928,0,(char *)0x0,(ulong)local_a88);
  }
  else {
LAB_001683aa:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a88,(ulong)local_928);
  }
  local_b28 = &local_b18;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_b18 = *puVar16;
    lStack_b10 = puVar12[3];
  }
  else {
    local_b18 = *puVar16;
    local_b28 = (ulong *)*puVar12;
  }
  local_b20 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_b28);
  local_b68 = &local_b58;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_b58 = *puVar16;
    lStack_b50 = plVar10[3];
  }
  else {
    local_b58 = *puVar16;
    local_b68 = (ulong *)*plVar10;
  }
  local_b60 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_7e8 = &local_7d8;
  std::__cxx11::string::_M_construct((ulong)&local_7e8,'\x03');
  uVar19 = 0xf;
  if (local_b68 != &local_b58) {
    uVar19 = local_b58;
  }
  if (uVar19 < (ulong)(local_7e0 + local_b60)) {
    uVar19 = 0xf;
    if (local_7e8 != &local_7d8) {
      uVar19 = local_7d8;
    }
    if (uVar19 < (ulong)(local_7e0 + local_b60)) goto LAB_00168513;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_7e8,0,(char *)0x0,(ulong)local_b68);
  }
  else {
LAB_00168513:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b68,(ulong)local_7e8);
  }
  local_bc8 = &local_bb8;
  puVar16 = puVar12 + 2;
  if ((ulong *)*puVar12 == puVar16) {
    local_bb8 = *puVar16;
    lStack_bb0 = puVar12[3];
  }
  else {
    local_bb8 = *puVar16;
    local_bc8 = (ulong *)*puVar12;
  }
  local_bc0 = puVar12[1];
  *puVar12 = puVar16;
  puVar12[1] = 0;
  *(undefined1 *)puVar16 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_bc8);
  local_c08._M_dataplus._M_p = (pointer)&local_c08.field_2;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar16) {
    local_c08.field_2._M_allocated_capacity = *puVar16;
    local_c08.field_2._8_8_ = plVar10[3];
  }
  else {
    local_c08.field_2._M_allocated_capacity = *puVar16;
    local_c08._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_c08._M_string_length = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_700 = &local_6f0;
  std::__cxx11::string::_M_construct((ulong)&local_700,'\x03');
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
    uVar21 = local_c08.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_6f8 + local_c08._M_string_length) {
    uVar19 = 0xf;
    if (local_700 != &local_6f0) {
      uVar19 = local_6f0;
    }
    if (uVar19 < local_6f8 + local_c08._M_string_length) goto LAB_0016867c;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_700,0,(char *)0x0,(ulong)local_c08._M_dataplus._M_p);
  }
  else {
LAB_0016867c:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c08,(ulong)local_700);
  }
  local_c48._M_dataplus._M_p = (pointer)&local_c48.field_2;
  psVar15 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_c48.field_2._M_allocated_capacity = *psVar15;
    local_c48.field_2._8_8_ = puVar12[3];
  }
  else {
    local_c48.field_2._M_allocated_capacity = *psVar15;
    local_c48._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_c48._M_string_length = puVar12[1];
  *puVar12 = psVar15;
  puVar12[1] = 0;
  *(undefined1 *)psVar15 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_c48);
  local_c68 = &local_c58;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_c58 = *puVar16;
    lStack_c50 = plVar10[3];
  }
  else {
    local_c58 = *puVar16;
    local_c68 = (ulong *)*plVar10;
  }
  local_c60 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_788 = &local_778;
  std::__cxx11::string::_M_construct((ulong)&local_788,'\x03');
  uVar19 = 0xf;
  if (local_c68 != &local_c58) {
    uVar19 = local_c58;
  }
  if (uVar19 < (ulong)(local_780 + local_c60)) {
    uVar19 = 0xf;
    if (local_788 != &local_778) {
      uVar19 = local_778;
    }
    if ((ulong)(local_780 + local_c60) <= uVar19) {
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_788,0,(char *)0x0,(ulong)local_c68);
      goto LAB_001687fb;
    }
  }
  puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c68,(ulong)local_788);
LAB_001687fb:
  local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
  psVar15 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_c88.field_2._M_allocated_capacity = *psVar15;
    local_c88.field_2._8_8_ = puVar12[3];
  }
  else {
    local_c88.field_2._M_allocated_capacity = *psVar15;
    local_c88._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_c88._M_string_length = puVar12[1];
  *puVar12 = psVar15;
  puVar12[1] = 0;
  *(undefined1 *)psVar15 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_c88);
  local_ca8 = &local_c98;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_c98 = *puVar16;
    lStack_c90 = plVar10[3];
  }
  else {
    local_c98 = *puVar16;
    local_ca8 = (ulong *)*plVar10;
  }
  local_ca0 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    operator_delete(local_c88._M_dataplus._M_p);
  }
  if (local_788 != &local_778) {
    operator_delete(local_788);
  }
  if (local_c68 != &local_c58) {
    operator_delete(local_c68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
    operator_delete(local_c48._M_dataplus._M_p);
  }
  if (local_700 != &local_6f0) {
    operator_delete(local_700);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
    operator_delete(local_c08._M_dataplus._M_p);
  }
  if (local_bc8 != &local_bb8) {
    operator_delete(local_bc8);
  }
  if (local_7e8 != &local_7d8) {
    operator_delete(local_7e8);
  }
  if (local_b68 != &local_b58) {
    operator_delete(local_b68);
  }
  if (local_b28 != &local_b18) {
    operator_delete(local_b28);
  }
  if (local_928 != &local_918) {
    operator_delete(local_928);
  }
  if (local_a88 != &local_a78) {
    operator_delete(local_a88);
  }
  if (local_9a8 != &local_998) {
    operator_delete(local_9a8);
  }
  if (local_8a8 != &local_898) {
    operator_delete(local_8a8);
  }
  if (local_aa8 != &local_a98) {
    operator_delete(local_aa8);
  }
  if (local_888 != &local_878) {
    operator_delete(local_888);
  }
  if (local_9e8 != &local_9d8) {
    operator_delete(local_9e8);
  }
  if (local_a28 != &local_a18) {
    operator_delete(local_a28);
  }
  if (local_988 != &local_978) {
    operator_delete(local_988);
  }
  if (local_948 != &local_938) {
    operator_delete(local_948);
  }
  if (local_a08 != &local_9f8) {
    operator_delete(local_a08);
  }
  if (local_908 != &local_8f8) {
    operator_delete(local_908);
  }
  if (local_a48 != &local_a38) {
    operator_delete(local_a48);
  }
  if (local_ac8 != &local_ab8) {
    operator_delete(local_ac8);
  }
  if (local_9c8 != &local_9b8) {
    operator_delete(local_9c8);
  }
  if (local_a68 != &local_a58) {
    operator_delete(local_a68);
  }
  if (local_ae8 != &local_ad8) {
    operator_delete(local_ae8);
  }
  if (local_8e8 != &local_8d8) {
    operator_delete(local_8e8);
  }
  if (local_968 != &local_958) {
    operator_delete(local_968);
  }
  if (local_848 != &local_838) {
    operator_delete(local_848);
  }
  if (local_8c8 != &local_8b8) {
    operator_delete(local_8c8);
  }
  if (local_cc8 != &local_cb8) {
    operator_delete(local_cc8);
  }
  if (local_868 != &local_858) {
    operator_delete(local_868);
  }
  if (local_828 != &local_818) {
    operator_delete(local_828);
  }
  std::operator+(&local_c08,&local_b08,&local_ba8);
  plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_c08,(ulong)local_b88);
  local_c48._M_dataplus._M_p = (pointer)&local_c48.field_2;
  psVar15 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_c48.field_2._M_allocated_capacity = *psVar15;
    local_c48.field_2._8_8_ = plVar10[3];
  }
  else {
    local_c48.field_2._M_allocated_capacity = *psVar15;
    local_c48._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_c48._M_string_length = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_c48,(ulong)local_c28);
  local_c68 = &local_c58;
  puVar16 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar16) {
    local_c58 = *puVar16;
    lStack_c50 = plVar10[3];
  }
  else {
    local_c58 = *puVar16;
    local_c68 = (ulong *)*plVar10;
  }
  local_c60 = plVar10[1];
  *plVar10 = (long)puVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_c68,(ulong)local_ca8);
  local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
  psVar15 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_c88.field_2._M_allocated_capacity = *psVar15;
    local_c88.field_2._8_8_ = plVar10[3];
  }
  else {
    local_c88.field_2._M_allocated_capacity = *psVar15;
    local_c88._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_c88._M_string_length = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_c88,(ulong)local_7c8._M_dataplus._M_p);
  psVar6 = local_1e0;
  (local_1e0->_M_dataplus)._M_p = (pointer)&local_1e0->field_2;
  psVar15 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar15) {
    lVar22 = plVar10[3];
    (local_1e0->field_2)._M_allocated_capacity = *psVar15;
    *(long *)((long)&local_1e0->field_2 + 8) = lVar22;
  }
  else {
    (local_1e0->_M_dataplus)._M_p = (pointer)*plVar10;
    (local_1e0->field_2)._M_allocated_capacity = *psVar15;
  }
  local_1e0->_M_string_length = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    operator_delete(local_c88._M_dataplus._M_p);
  }
  if (local_c68 != &local_c58) {
    operator_delete(local_c68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
    operator_delete(local_c48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
    operator_delete(local_c08._M_dataplus._M_p);
  }
  if (local_ca8 != &local_c98) {
    operator_delete(local_ca8);
  }
  if (local_c28 != &local_c18) {
    operator_delete(local_c28);
  }
  if (local_be8 != &local_bd8) {
    operator_delete(local_be8);
  }
  if (local_b88 != &local_b78) {
    operator_delete(local_b88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
    operator_delete(local_ba8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48._M_dataplus._M_p != &local_b48.field_2) {
    operator_delete(local_b48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b08._M_dataplus._M_p != &local_b08.field_2) {
    operator_delete(local_b08._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p);
  }
  if (local_7a8 != &local_798) {
    operator_delete(local_7a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p);
  }
  if (local_6c0[0] != local_6b0) {
    operator_delete(local_6c0[0]);
  }
  if (local_2a0[0] != local_290) {
    operator_delete(local_2a0[0]);
  }
  lVar22 = 0;
  do {
    if (local_718 + lVar22 != *(undefined1 **)((long)local_728 + lVar22)) {
      operator_delete(*(undefined1 **)((long)local_728 + lVar22));
    }
    lVar22 = lVar22 + -0x20;
  } while (lVar22 != -0x40);
  return psVar6;
}

Assistant:

std::string RegressionTree::dynamicFunctionsGenerator()
{
    std::string condition[] = {" <= "," == "};
    
    std::string varList = "", relationMap = ""; 
    for (size_t var = 0; var< _td->numberOfAttributes(); ++var)
    {
        const std::string varName = _td->getAttribute(var)->_name;

	varList += "\""+varName+"\","; 
	relationMap += std::to_string(_queryRootIndex[var])+",";        
    }
    varList.pop_back();
    relationMap.pop_back();
    
    std::string relationName = "", varTypeList = "", conditionsString = ""; 
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
    {
	relationName += "\""+_td->getRelation(rel)->_name+"\",";
        conditionsString += "\"\",";

        varTypeList += "\"";

        var_bitset& bag = _td->getRelation(rel)->_bag;
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (bag[var])
            {
                Attribute* att = _td->getAttribute(var);
                varTypeList += typeToStr(att->_type)+" "+att->_name+",";
            }
        }
        varTypeList.pop_back();
        varTypeList += "\",";
    }
    relationName.pop_back();
    conditionsString.pop_back();
    varTypeList.pop_back();
    
    std::string headerFiles =offset(0)+
        "#include <fstream>\n"+
        "#include <vector>\n"+
        "#include \"RegressionTreeNode.hpp\"\n\n"+
        "#include <boost/spirit/include/qi.hpp>\n"+
        "#include <boost/spirit/include/phoenix_core.hpp>\n"+
        "#include <boost/spirit/include/phoenix_operator.hpp>\n\n"+
        "namespace qi = boost::spirit::qi;\n"+
        "namespace phoenix = boost::phoenix;\n\n";
    
    std::string genDynFuncs =
        "void generateDynamicFunctions(std::vector<Condition>& conditions)\n{\n"+
	offset(1)+"std::string variableMap[] = {"+varList+"};\n"+
	offset(1)+"std::string variableList[] = {"+varTypeList+"};\n"+
	offset(1)+"size_t relationMap[] = {"+relationMap+"};\n"+
	offset(1)+"std::string relationName[] = {"+relationName+"};\n"+
        offset(1)+"std::string conditionStr[] = {"+conditionsString+"};\n"+
        offset(1)+"for (Condition& c : conditions)\n"+
        offset(2)+"conditionStr[relationMap[c.variable]] += variableMap[c.variable] + "+
        "c.op + std::to_string(c.threshold) + \"&&\";\n"+
        offset(1)+"std::ofstream ofs(\"DynamicFunctions.cpp\", "+
        "std::ofstream::out);\n"+
        offset(1)+"ofs << \"#include \\\"DynamicFunctions.h\\\"\\n"+
        "namespace lmfao\\n{\\n\";\n"+
        offset(1)+"for (size_t rel = 0; rel < "+
        std::to_string(_td->numberOfRelations())+"; ++rel)\n"+offset(1)+"{\n"+
        offset(2)+"if (!conditionStr[rel].empty())\n"+offset(2)+"{\n"+
        offset(3)+"conditionStr[rel].pop_back();\n"+
        offset(3)+"conditionStr[rel].pop_back();\n"+
        offset(3)+"ofs << \"double f_\"+relationName[rel]+\"(\"+"+
        "variableList[rel]+\")\\n"+
        "{\\n\treturn (\"+conditionStr[rel]+\" ? 1.0 : 0.0);\\n}\\n\";\n"+
        offset(2)+"}\n"+offset(2)+"else\n"+offset(2)+"{\n"+
        offset(3)+"ofs << \"double f_\"+relationName[rel]+"+
        "\"(\"+variableList[rel]+\")\\n"+
        "{\\n\\treturn 1.0;\\n}\\n\";\n"+
        offset(2)+"}\n"+offset(1)+"}\n"+
        offset(1)+"ofs << \"}\\n\";\n"+offset(1)+"ofs.close();\n}\n";


    /********************************************************/
    /************ This is for loading Test Data *************/
    /********************************************************/
    
    // TODO: This should only output the features not all variables.
    // If changed it should be changed in the SQL generator as well.
    std::string attributeString = "",
        attrConstruct = offset(3)+"qi::phrase_parse(tuple.begin(),tuple.end(),";
        
    for (size_t var = 0; var < _td->numberOfAttributes(); ++var)
    {
        Attribute* att = _td->getAttribute(var);
        attrConstruct += "\n"+offset(4)+"qi::"+typeToStr(att->_type)+
            "_[phoenix::ref("+att->_name+") = qi::_1]>>";
        attributeString += offset(1)+typeToStr(att->_type) + " "+
            att->_name + ";\n";
    }

    // attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct += ",\n"+offset(4)+"\'|\');\n";

    std::string testTuple = "\nstruct Test_tuple\n{\n"+
        attributeString+offset(1)+"Test_tuple(const std::string& tuple)\n"+
        offset(1)+"{\n"+attrConstruct+offset(1)+"}\n};\n\n";

    std::string loadFunction =
        "void loadTestDataset(std::vector<Test_tuple>& TestDataset)\n{\n"+
        offset(1)+"std::ifstream input;\n"+offset(1)+"std::string line;\n"+
        offset(1)+"input.open(\""+PATH_TO_DATA+"/test_data.tbl\");\n"+
        offset(1)+"if (!input)\n"+offset(1)+"{\n"+
        offset(2)+"std::cerr << \"TestDataset.tbl does is not exist.\\n\";\n"+
        offset(2)+"exit(1);\n"+offset(1)+"}\n"+
        offset(1)+"while(getline(input, line))\n"+
        offset(2)+"TestDataset.push_back(Test_tuple(line));\n"+
        offset(1)+"input.close();\n}\n\n";
    

    /****************************************************************/
    /************ This is for finding prediction & eval *************/
    /****************************************************************/

    std::string findPredSwitch=""; 
    for (size_t var = 0; var< _td->numberOfAttributes(); ++var)
    {
        const std::string& varName = _td->getAttribute(var)->_name;
        findPredSwitch += offset(3)+"case "+std::to_string(var)+" : "+
            "goLeft = (tuple."+varName+condition[_categoricalFeatures[var]]+
            "c.threshold); break;\n";       
    }
    
    std::string findPrediction =
        "double findPrediction(const RegTreeNode* node, const Test_tuple& tuple)\n{\n"+
        offset(1)+"if (node->isLeaf)\n"+
        offset(2)+"return node->prediction;\n\n"+
        offset(1)+"bool goLeft = true;\n"+
        offset(1)+"const Condition& c = node->condition;\n"+
        offset(1)+"switch (c.variable)\n"+
        offset(1)+"{\n"+findPredSwitch+offset(1)+"}\n"+
        offset(1)+"if (goLeft)\n"+
        offset(2)+"return findPrediction(node->lchild, tuple);\n"+
        offset(1)+"else\n"+
        offset(2)+"return findPrediction(node->rchild, tuple);\n}\n\n";
    
    std::string evalFunction = "void evaluateModel(const RegTreeNode* root)\n{\n"+
        offset(1)+"std::vector<Test_tuple> TestDataset;\n"+
        offset(1)+"loadTestDataset(TestDataset);\n"+
        offset(1)+"double pred, diff, error = 0.0;\n"+
        offset(1)+"for (const Test_tuple& tuple : TestDataset)\n"+offset(2)+"{\n"+
        offset(2)+"pred = findPrediction(root, tuple);\n"+
        offset(2)+"diff = tuple."+_td->getAttribute(_labelID)->_name+"-pred;\n"+
        offset(2)+"error += diff * diff;\n"+
        offset(1)+"}\n"+
        offset(1)+"error /= TestDataset.size();\n"+
        offset(1)+"std::cout << \"RMSE: \" << sqrt(error) << std::endl;\n}\n\n";
    
    return headerFiles+testTuple+loadFunction+findPrediction+evalFunction+genDynFuncs;
}